

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.c
# Opt level: O3

void BrotliSplitBlock(MemoryManager *m,Command_conflict *cmds,size_t num_commands,uint8_t *data,
                     size_t pos,size_t mask,BrotliEncoderParams *params,BlockSplit *literal_split,
                     BlockSplit *insert_and_copy_split,BlockSplit *dist_split)

{
  int *piVar1;
  long *plVar2;
  uint uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  ushort uVar15;
  size_t byte_ix;
  Command_conflict *pCVar16;
  uint8_t *puVar17;
  uint32_t *puVar18;
  HistogramLiteral *pHVar19;
  ulong uVar20;
  void *pvVar21;
  uint16_t *puVar22;
  HistogramCommand *out;
  HistogramCommand *pHVar23;
  void *pvVar24;
  ulong uVar25;
  ushort *puVar26;
  void *pvVar27;
  void *pvVar28;
  void *pvVar29;
  void *pvVar30;
  HistogramDistance *out_00;
  HistogramDistance *pHVar31;
  uint32_t *__dest;
  uint32_t *puVar32;
  long lVar33;
  ulong uVar34;
  long lVar35;
  byte *pbVar36;
  uint *puVar37;
  void *pvVar38;
  size_t sVar39;
  size_t sVar40;
  ulong uVar41;
  ulong uVar42;
  byte bVar43;
  uint uVar44;
  byte bVar45;
  ulong uVar46;
  uint32_t uVar47;
  size_t __n;
  long lVar48;
  uint *puVar49;
  uint uVar50;
  size_t __n_00;
  long lVar51;
  size_t sVar52;
  long lVar53;
  ulong uVar54;
  double dVar55;
  int iVar62;
  double dVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  int iVar63;
  undefined1 auVar61 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  double dVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  int iVar119;
  int iVar120;
  int iVar127;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  int iVar128;
  undefined1 auVar126 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  uint32_t *local_1008;
  HistogramLiteral *local_1000;
  long local_ff8;
  HistogramCommand *local_ff0;
  void *local_fe0;
  void *local_fd8;
  void *local_fd0;
  uint32_t *local_fc0;
  uint32_t *local_fb0;
  void *local_fa8;
  uint32_t *local_fa0;
  ulong local_f98;
  ulong local_f90;
  long local_f80;
  HistogramPair *local_f78;
  HistogramPair *local_f68;
  uint32_t new_clusters [64];
  uint32_t symbols [64];
  uint32_t sizes [64];
  uint32_t remap [64];
  undefined1 local_b40 [2176];
  ulong local_2c0;
  double local_2b8;
  ulong local_40;
  double local_38;
  
  if (num_commands == 0) {
    local_fd8 = (void *)0x0;
LAB_0011bdb9:
    literal_split->num_types = 1;
  }
  else {
    pCVar16 = cmds;
    sVar40 = 0;
    sVar52 = num_commands;
    do {
      sVar39 = sVar40;
      uVar41 = (ulong)pCVar16->insert_len_;
      sVar40 = sVar39 + uVar41;
      pCVar16 = pCVar16 + 1;
      sVar52 = sVar52 - 1;
    } while (sVar52 != 0);
    if (sVar40 == 0) {
      local_fd8 = (void *)0x0;
    }
    else {
      local_fd8 = BrotliAllocate(m,sVar40);
    }
    puVar18 = &cmds->copy_len_;
    lVar53 = 0;
    sVar52 = num_commands;
    do {
      uVar54 = pos & mask;
      __n_00 = (size_t)((Command_conflict *)(puVar18 + -1))->insert_len_;
      if (mask < uVar54 + __n_00) {
        __n = (mask + 1) - uVar54;
        memcpy((void *)((long)local_fd8 + lVar53),data + uVar54,__n);
        lVar53 = lVar53 + __n;
        __n_00 = __n_00 - __n;
        uVar54 = 0;
      }
      if (__n_00 != 0) {
        memcpy((void *)((long)local_fd8 + lVar53),data + uVar54,__n_00);
        lVar53 = lVar53 + __n_00;
      }
      pos = (ulong)(*puVar18 & 0x1ffffff) + __n_00 + uVar54;
      puVar18 = puVar18 + 4;
      sVar52 = sVar52 - 1;
    } while (sVar52 != 0);
    uVar54 = 100;
    if (sVar40 < 0xd480) {
      uVar54 = (ulong)(((uint)sVar40 & 0xffff) / 0x220 + 1);
    }
    if (sVar40 == 0) goto LAB_0011bdb9;
    if (sVar40 < 0x80) {
      sVar52 = literal_split->num_blocks;
      uVar54 = literal_split->types_alloc_size;
      uVar41 = sVar52 + 1;
      if (uVar54 < uVar41) {
        if (uVar54 == 0) {
          uVar54 = uVar41;
        }
        do {
          uVar42 = uVar54;
          uVar54 = uVar42 * 2;
        } while (uVar42 < uVar41);
        puVar17 = (uint8_t *)BrotliAllocate(m,uVar42);
        if (literal_split->types_alloc_size != 0) {
          memcpy(puVar17,literal_split->types,literal_split->types_alloc_size);
        }
        BrotliFree(m,literal_split->types);
        literal_split->types = puVar17;
        literal_split->types_alloc_size = uVar42;
        sVar52 = literal_split->num_blocks;
        uVar41 = sVar52 + 1;
      }
      uVar54 = literal_split->lengths_alloc_size;
      if (uVar54 < uVar41) {
        if (uVar54 == 0) {
          uVar54 = uVar41;
        }
        do {
          uVar42 = uVar54;
          uVar54 = uVar42 * 2;
        } while (uVar42 < uVar41);
        puVar18 = (uint32_t *)BrotliAllocate(m,uVar42 * 4);
        if (literal_split->lengths_alloc_size != 0) {
          memcpy(puVar18,literal_split->lengths,literal_split->lengths_alloc_size << 2);
        }
        BrotliFree(m,literal_split->lengths);
        literal_split->lengths = puVar18;
        literal_split->lengths_alloc_size = uVar42;
        sVar52 = literal_split->num_blocks;
      }
      literal_split->num_types = 1;
      literal_split->types[sVar52] = '\0';
      sVar52 = literal_split->num_blocks;
      literal_split->lengths[sVar52] = (uint)sVar40;
      literal_split->num_blocks = sVar52 + 1;
    }
    else {
      pvVar21 = BrotliAllocate(m,uVar54 * 0x410);
      lVar53 = 0;
      do {
        memset((void *)(lVar53 + (long)pvVar21),0,0x408);
        *(undefined8 *)((long)pvVar21 + lVar53 + 0x408) = 0x7ff0000000000000;
        lVar53 = lVar53 + 0x410;
      } while (uVar54 * 0x410 - lVar53 != 0);
      uVar46 = 0;
      uVar42 = 7;
      do {
        uVar25 = (uVar46 * sVar40) / uVar54;
        if (uVar46 != 0) {
          uVar42 = (ulong)(uint)((int)uVar42 * 0x41a7);
          uVar25 = uVar25 + uVar42 % (sVar40 / uVar54);
        }
        if (sVar40 <= uVar25 + 0x46) {
          uVar25 = sVar40 - 0x47;
        }
        plVar2 = (long *)((long)pvVar21 + uVar46 * 0x410 + 0x400);
        *plVar2 = *plVar2 + 0x46;
        lVar53 = -0x46;
        do {
          piVar1 = (int *)((long)pvVar21 +
                          (ulong)*(byte *)((long)local_fd8 + lVar53 + uVar25 + 0x46) * 4 +
                          uVar46 * 0x410);
          *piVar1 = *piVar1 + 1;
          lVar53 = lVar53 + 1;
        } while (lVar53 != 0);
        uVar46 = uVar46 + 1;
      } while (uVar46 != uVar54);
      uVar42 = (sVar40 * 2) / 0x46 + uVar54 + 99;
      if (uVar42 != uVar42 % uVar54) {
        uVar25 = 7;
        uVar46 = 0;
        do {
          memset(local_b40,0,0x408);
          uVar25 = (ulong)(uint)((int)uVar25 * 0x41a7);
          pbVar36 = (byte *)(uVar25 % (sVar40 - 0x45) + (long)local_fd8);
          lVar53 = -0x46;
          do {
            bVar43 = *pbVar36;
            pbVar36 = pbVar36 + 1;
            *(int *)(local_b40 + (ulong)bVar43 * 4) = *(int *)(local_b40 + (ulong)bVar43 * 4) + 1;
            lVar53 = lVar53 + 1;
          } while (lVar53 != 0);
          lVar53 = (uVar46 % uVar54) * 0x410;
          plVar2 = (long *)((long)pvVar21 + lVar53 + 0x400);
          *plVar2 = *plVar2 + 0x46;
          lVar35 = 0;
          do {
            lVar51 = lVar35 * 4;
            piVar1 = (int *)((long)pvVar21 + lVar35 * 4 + lVar53);
            auVar64._0_4_ = *piVar1 + *(int *)(local_b40 + lVar51);
            auVar64._4_4_ = piVar1[1] + *(int *)(local_b40 + lVar51 + 4);
            auVar64._8_4_ = piVar1[2] + *(int *)(local_b40 + lVar51 + 8);
            auVar64._12_4_ = piVar1[3] + *(int *)(local_b40 + lVar51 + 0xc);
            *(undefined1 (*) [16])((long)pvVar21 + lVar35 * 4 + lVar53) = auVar64;
            lVar35 = lVar35 + 4;
          } while (lVar35 != 0x100);
          uVar46 = uVar46 + 1;
        } while (uVar46 < uVar42 - uVar42 % uVar54);
      }
      pvVar24 = BrotliAllocate(m,sVar40);
      iVar120 = (int)uVar54;
      pvVar27 = BrotliAllocate(m,(ulong)(uint)(iVar120 << 0xb));
      pvVar28 = BrotliAllocate(m,(ulong)(uint)(iVar120 * 8));
      sVar52 = (iVar120 + 7U >> 3) * sVar40;
      if (sVar52 == 0) {
        local_fa8 = (void *)0x0;
      }
      else {
        local_fa8 = BrotliAllocate(m,sVar52);
      }
      pvVar29 = BrotliAllocate(m,(ulong)(uint)(iVar120 * 2));
      lVar53 = 3;
      if (10 < params->quality) {
        lVar53 = 10;
      }
      lVar35 = sVar39 + uVar41;
      lVar51 = 0;
      do {
        uVar42 = uVar54 + 7 >> 3;
        if (uVar54 < 2) {
          memset(pvVar24,0,sVar40);
          uVar46 = 1;
          auVar64 = _DAT_0016bcd0;
        }
        else {
          memset(pvVar27,0,uVar54 << 0xb);
          uVar46 = 0;
          puVar37 = (uint *)((long)pvVar21 + 0x400);
          do {
            uVar25 = (ulong)*puVar37;
            if (uVar25 < 0x100) {
              dVar56 = (double)kLog2Table[uVar25];
            }
            else {
              dVar56 = log2((double)uVar25);
            }
            *(double *)((long)pvVar27 + uVar46 * 8) = dVar56;
            uVar46 = uVar46 + 1;
            puVar37 = puVar37 + 0x104;
          } while (uVar54 != uVar46);
          pvVar30 = (void *)(uVar54 * 0x7f8 + (long)pvVar27);
          lVar48 = 0x100;
          puVar37 = (uint *)((long)pvVar21 + 0x3fc);
          do {
            lVar48 = lVar48 + -1;
            uVar46 = 0;
            puVar49 = puVar37;
            do {
              dVar55 = -2.0;
              dVar56 = *(double *)((long)pvVar27 + uVar46 * 8);
              uVar25 = (ulong)*puVar49;
              if (uVar25 != 0) {
                if (*puVar49 < 0x100) {
                  dVar55 = (double)kLog2Table[uVar25];
                }
                else {
                  dVar55 = log2((double)uVar25);
                }
              }
              *(double *)((long)pvVar30 + uVar46 * 8) = dVar56 - dVar55;
              uVar46 = uVar46 + 1;
              puVar49 = puVar49 + 0x104;
            } while (uVar54 != uVar46);
            pvVar30 = (void *)((long)pvVar30 + uVar54 * -8);
            puVar37 = puVar37 + -1;
          } while (lVar48 != 0);
          memset(pvVar28,0,uVar54 * 8);
          memset(local_fa8,0,uVar42 * sVar40);
          auVar64 = _DAT_0016bcd0;
          uVar46 = 0;
          do {
            bVar43 = *(byte *)((long)local_fd8 + uVar46);
            uVar25 = 0;
            dVar56 = 1e+99;
            do {
              dVar55 = *(double *)((long)pvVar27 + uVar25 * 8 + bVar43 * uVar54 * 8) +
                       *(double *)((long)pvVar28 + uVar25 * 8);
              *(double *)((long)pvVar28 + uVar25 * 8) = dVar55;
              if (dVar55 < dVar56) {
                *(char *)((long)pvVar24 + uVar46) = (char)uVar25;
                dVar56 = dVar55;
              }
              uVar25 = uVar25 + 1;
            } while (uVar54 != uVar25);
            dVar55 = 28.1;
            if (uVar46 < 2000) {
              dVar55 = (((double)(long)uVar46 * 0.07) / 2000.0 + 0.77) * 28.1;
            }
            uVar25 = 0;
            do {
              dVar72 = *(double *)((long)pvVar28 + uVar25 * 8) - dVar56;
              *(double *)((long)pvVar28 + uVar25 * 8) = dVar72;
              if (dVar55 <= dVar72) {
                *(double *)((long)pvVar28 + uVar25 * 8) = dVar55;
                pbVar36 = (byte *)((long)local_fa8 + (uVar25 >> 3) + uVar46 * uVar42);
                *pbVar36 = *pbVar36 | '\x01' << ((byte)uVar25 & 7);
              }
              uVar25 = uVar25 + 1;
            } while (uVar54 != uVar25);
            uVar46 = uVar46 + 1;
          } while (uVar46 != sVar40);
          bVar43 = *(byte *)((long)pvVar24 + (sVar40 - 1));
          pvVar30 = (void *)((sVar39 + uVar41 + -2) * uVar42 + (long)local_fa8);
          uVar46 = 1;
          lVar48 = lVar35;
          do {
            if ((*(byte *)((long)pvVar30 + (ulong)(bVar43 >> 3)) >> (bVar43 & 7) & 1) != 0) {
              bVar45 = *(byte *)((long)pvVar24 + lVar48 + -2);
              uVar46 = uVar46 + (bVar43 != bVar45);
              bVar43 = bVar45;
            }
            *(byte *)((long)pvVar24 + lVar48 + -2) = bVar43;
            pvVar30 = (void *)((long)pvVar30 - uVar42);
            lVar48 = lVar48 + -1;
          } while (lVar48 != 1);
        }
        if (uVar54 != 0) {
          lVar48 = uVar54 - 1;
          auVar100._8_4_ = (int)lVar48;
          auVar100._0_8_ = lVar48;
          auVar100._12_4_ = (int)((ulong)lVar48 >> 0x20);
          auVar100 = auVar100 ^ auVar64;
          lVar48 = 0;
          auVar95 = _DAT_0016bcc0;
          auVar133 = _DAT_0016bcb0;
          auVar137 = _DAT_0016cb80;
          auVar99 = _DAT_0016cb70;
          do {
            auVar116 = auVar95 ^ auVar64;
            iVar120 = auVar100._0_4_;
            iVar119 = -(uint)(iVar120 < auVar116._0_4_);
            iVar62 = auVar100._4_4_;
            auVar79._4_4_ = -(uint)(iVar62 < auVar116._4_4_);
            iVar128 = auVar100._8_4_;
            iVar127 = -(uint)(iVar128 < auVar116._8_4_);
            iVar63 = auVar100._12_4_;
            auVar79._12_4_ = -(uint)(iVar63 < auVar116._12_4_);
            auVar107._4_4_ = iVar119;
            auVar107._0_4_ = iVar119;
            auVar107._8_4_ = iVar127;
            auVar107._12_4_ = iVar127;
            auVar129 = pshuflw(in_XMM8,auVar107,0xe8);
            auVar81._4_4_ = -(uint)(auVar116._4_4_ == iVar62);
            auVar81._12_4_ = -(uint)(auVar116._12_4_ == iVar63);
            auVar81._0_4_ = auVar81._4_4_;
            auVar81._8_4_ = auVar81._12_4_;
            auVar136 = pshuflw(in_XMM9,auVar81,0xe8);
            auVar79._0_4_ = auVar79._4_4_;
            auVar79._8_4_ = auVar79._12_4_;
            auVar130 = pshuflw(auVar129,auVar79,0xe8);
            auVar116._8_4_ = 0xffffffff;
            auVar116._0_8_ = 0xffffffffffffffff;
            auVar116._12_4_ = 0xffffffff;
            auVar116 = (auVar130 | auVar136 & auVar129) ^ auVar116;
            auVar116 = packssdw(auVar116,auVar116);
            if ((auVar116 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar29 + lVar48) = 0x100;
            }
            auVar79 = auVar81 & auVar107 | auVar79;
            auVar116 = packssdw(auVar79,auVar79);
            auVar130._8_4_ = 0xffffffff;
            auVar130._0_8_ = 0xffffffffffffffff;
            auVar130._12_4_ = 0xffffffff;
            auVar116 = packssdw(auVar116 ^ auVar130,auVar116 ^ auVar130);
            if ((auVar116._0_4_ >> 0x10 & 1) != 0) {
              *(undefined2 *)((long)pvVar29 + lVar48 + 2) = 0x100;
            }
            auVar116 = auVar133 ^ auVar64;
            iVar119 = -(uint)(iVar120 < auVar116._0_4_);
            auVar121._4_4_ = -(uint)(iVar62 < auVar116._4_4_);
            iVar127 = -(uint)(iVar128 < auVar116._8_4_);
            auVar121._12_4_ = -(uint)(iVar63 < auVar116._12_4_);
            auVar80._4_4_ = iVar119;
            auVar80._0_4_ = iVar119;
            auVar80._8_4_ = iVar127;
            auVar80._12_4_ = iVar127;
            auVar106._4_4_ = -(uint)(auVar116._4_4_ == iVar62);
            auVar106._12_4_ = -(uint)(auVar116._12_4_ == iVar63);
            auVar106._0_4_ = auVar106._4_4_;
            auVar106._8_4_ = auVar106._12_4_;
            auVar121._0_4_ = auVar121._4_4_;
            auVar121._8_4_ = auVar121._12_4_;
            auVar116 = auVar106 & auVar80 | auVar121;
            auVar116 = packssdw(auVar116,auVar116);
            auVar13._8_4_ = 0xffffffff;
            auVar13._0_8_ = 0xffffffffffffffff;
            auVar13._12_4_ = 0xffffffff;
            auVar116 = packssdw(auVar116 ^ auVar13,auVar116 ^ auVar13);
            if ((auVar116 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar29 + lVar48 + 4) = 0x100;
            }
            auVar81 = pshufhw(auVar80,auVar80,0x84);
            auVar107 = pshufhw(auVar106,auVar106,0x84);
            auVar79 = pshufhw(auVar81,auVar121,0x84);
            auVar82._8_4_ = 0xffffffff;
            auVar82._0_8_ = 0xffffffffffffffff;
            auVar82._12_4_ = 0xffffffff;
            auVar82 = (auVar79 | auVar107 & auVar81) ^ auVar82;
            auVar81 = packssdw(auVar82,auVar82);
            if ((auVar81 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar29 + lVar48 + 6) = 0x100;
            }
            auVar81 = auVar137 ^ auVar64;
            iVar119 = -(uint)(iVar120 < auVar81._0_4_);
            auVar84._4_4_ = -(uint)(iVar62 < auVar81._4_4_);
            iVar127 = -(uint)(iVar128 < auVar81._8_4_);
            auVar84._12_4_ = -(uint)(iVar63 < auVar81._12_4_);
            auVar108._4_4_ = iVar119;
            auVar108._0_4_ = iVar119;
            auVar108._8_4_ = iVar127;
            auVar108._12_4_ = iVar127;
            auVar116 = pshuflw(auVar116,auVar108,0xe8);
            auVar83._4_4_ = -(uint)(auVar81._4_4_ == iVar62);
            auVar83._12_4_ = -(uint)(auVar81._12_4_ == iVar63);
            auVar83._0_4_ = auVar83._4_4_;
            auVar83._8_4_ = auVar83._12_4_;
            in_XMM9 = pshuflw(auVar136 & auVar129,auVar83,0xe8);
            in_XMM9 = in_XMM9 & auVar116;
            auVar84._0_4_ = auVar84._4_4_;
            auVar84._8_4_ = auVar84._12_4_;
            auVar116 = pshuflw(auVar116,auVar84,0xe8);
            auVar129._8_4_ = 0xffffffff;
            auVar129._0_8_ = 0xffffffffffffffff;
            auVar129._12_4_ = 0xffffffff;
            auVar129 = (auVar116 | in_XMM9) ^ auVar129;
            auVar116 = packssdw(auVar129,auVar129);
            if ((auVar116 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar29 + lVar48 + 8) = 0x100;
            }
            auVar84 = auVar83 & auVar108 | auVar84;
            auVar116 = packssdw(auVar84,auVar84);
            auVar136._8_4_ = 0xffffffff;
            auVar136._0_8_ = 0xffffffffffffffff;
            auVar136._12_4_ = 0xffffffff;
            auVar116 = packssdw(auVar116 ^ auVar136,auVar116 ^ auVar136);
            if ((auVar116 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar29 + lVar48 + 10) = 0x100;
            }
            auVar116 = auVar99 ^ auVar64;
            iVar120 = -(uint)(iVar120 < auVar116._0_4_);
            auVar122._4_4_ = -(uint)(iVar62 < auVar116._4_4_);
            iVar128 = -(uint)(iVar128 < auVar116._8_4_);
            auVar122._12_4_ = -(uint)(iVar63 < auVar116._12_4_);
            auVar85._4_4_ = iVar120;
            auVar85._0_4_ = iVar120;
            auVar85._8_4_ = iVar128;
            auVar85._12_4_ = iVar128;
            auVar109._4_4_ = -(uint)(auVar116._4_4_ == iVar62);
            auVar109._12_4_ = -(uint)(auVar116._12_4_ == iVar63);
            auVar109._0_4_ = auVar109._4_4_;
            auVar109._8_4_ = auVar109._12_4_;
            auVar122._0_4_ = auVar122._4_4_;
            auVar122._8_4_ = auVar122._12_4_;
            auVar116 = auVar109 & auVar85 | auVar122;
            auVar116 = packssdw(auVar116,auVar116);
            auVar14._8_4_ = 0xffffffff;
            auVar14._0_8_ = 0xffffffffffffffff;
            auVar14._12_4_ = 0xffffffff;
            in_XMM8 = packssdw(auVar116 ^ auVar14,auVar116 ^ auVar14);
            if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar29 + lVar48 + 0xc) = 0x100;
            }
            auVar116 = pshufhw(auVar85,auVar85,0x84);
            auVar79 = pshufhw(auVar109,auVar109,0x84);
            auVar81 = pshufhw(auVar116,auVar122,0x84);
            auVar86._8_4_ = 0xffffffff;
            auVar86._0_8_ = 0xffffffffffffffff;
            auVar86._12_4_ = 0xffffffff;
            auVar86 = (auVar81 | auVar79 & auVar116) ^ auVar86;
            auVar116 = packssdw(auVar86,auVar86);
            if ((auVar116 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar29 + lVar48 + 0xe) = 0x100;
            }
            lVar33 = auVar95._8_8_;
            auVar95._0_8_ = auVar95._0_8_ + 8;
            auVar95._8_8_ = lVar33 + 8;
            lVar33 = auVar133._8_8_;
            auVar133._0_8_ = auVar133._0_8_ + 8;
            auVar133._8_8_ = lVar33 + 8;
            lVar33 = auVar137._8_8_;
            auVar137._0_8_ = auVar137._0_8_ + 8;
            auVar137._8_8_ = lVar33 + 8;
            lVar33 = auVar99._8_8_;
            auVar99._0_8_ = auVar99._0_8_ + 8;
            auVar99._8_8_ = lVar33 + 8;
            lVar48 = lVar48 + 0x10;
          } while (uVar42 * 0x10 != lVar48);
        }
        lVar48 = 0;
        uVar15 = 0;
        do {
          if (*(short *)((long)pvVar29 + (ulong)*(byte *)((long)pvVar24 + lVar48) * 2) == 0x100) {
            *(ushort *)((long)pvVar29 + (ulong)*(byte *)((long)pvVar24 + lVar48) * 2) = uVar15;
            uVar15 = uVar15 + 1;
          }
          lVar48 = lVar48 + 1;
        } while (lVar35 != lVar48);
        lVar48 = 0;
        do {
          *(undefined1 *)((long)pvVar24 + lVar48) =
               *(undefined1 *)((long)pvVar29 + (ulong)*(byte *)((long)pvVar24 + lVar48) * 2);
          lVar48 = lVar48 + 1;
        } while (lVar35 != lVar48);
        uVar54 = (ulong)uVar15;
        if (uVar15 != 0) {
          lVar48 = 0;
          do {
            memset((void *)((long)pvVar21 + lVar48),0,0x408);
            *(undefined8 *)((long)pvVar21 + lVar48 + 0x408) = 0x7ff0000000000000;
            lVar48 = lVar48 + 0x410;
          } while (uVar54 * 0x410 != lVar48);
        }
        lVar48 = 0;
        do {
          lVar33 = (ulong)*(byte *)((long)pvVar24 + lVar48) * 0x410;
          piVar1 = (int *)((long)pvVar21 + (ulong)*(byte *)((long)local_fd8 + lVar48) * 4 + lVar33);
          *piVar1 = *piVar1 + 1;
          plVar2 = (long *)((long)pvVar21 + lVar33 + 0x400);
          *plVar2 = *plVar2 + 1;
          lVar48 = lVar48 + 1;
        } while (lVar35 != lVar48);
        lVar51 = lVar51 + 1;
      } while (lVar51 != lVar53);
      BrotliFree(m,pvVar27);
      BrotliFree(m,pvVar28);
      BrotliFree(m,local_fa8);
      BrotliFree(m,pvVar29);
      BrotliFree(m,pvVar21);
      if (uVar46 == 0) {
        local_1000 = (HistogramLiteral *)BrotliAllocate(m,0x3cf0);
        local_fb0 = (uint32_t *)BrotliAllocate(m,0x3c);
        local_f90 = 0xf;
        sVar40 = 0;
        pvVar21 = (void *)0x0;
        local_fc0 = (uint32_t *)0x0;
        local_ff0 = (HistogramCommand *)0x0;
      }
      else {
        sVar40 = uVar46 * 4;
        local_fc0 = (uint32_t *)BrotliAllocate(m,sVar40);
        pvVar21 = BrotliAllocate(m,sVar40);
        uVar54 = uVar46 * 0x10 + 0x3f0;
        local_f90 = uVar54 >> 6;
        if (uVar54 < 0x40) {
          local_fb0 = (uint32_t *)0x0;
          local_1000 = (HistogramLiteral *)0x0;
        }
        else {
          local_1000 = (HistogramLiteral *)BrotliAllocate(m,local_f90 * 0x410);
          local_fb0 = (uint32_t *)BrotliAllocate(m,local_f90 * 4);
        }
        uVar54 = 0x40;
        if (uVar46 < 0x40) {
          uVar54 = uVar46;
        }
        local_ff0 = (HistogramCommand *)BrotliAllocate(m,uVar54 * 0x410);
      }
      local_f68 = (HistogramPair *)BrotliAllocate(m,0xc018);
      lVar35 = 0;
      memset(sizes,0,0x100);
      memset(new_clusters,0,0x100);
      memset(symbols,0,0x100);
      memset(remap,0,0x100);
      memset(pvVar21,0,sVar40);
      lVar53 = 0;
      do {
        piVar1 = (int *)((long)pvVar21 + lVar35 * 4);
        *piVar1 = *piVar1 + 1;
        if ((sVar39 + uVar41 + -1 == lVar53) ||
           (*(char *)((long)pvVar24 + lVar53) != *(char *)((long)pvVar24 + lVar53 + 1))) {
          lVar35 = lVar35 + 1;
        }
        lVar53 = lVar53 + 1;
      } while (sVar39 + uVar41 != lVar53);
      if (uVar46 == 0) {
        uVar41 = 0;
      }
      else {
        local_fa8 = (void *)0x0;
        local_f80 = 0;
        local_fe0 = (void *)0x0;
        uVar41 = 0;
        local_ff8 = 0;
        uVar54 = uVar46;
        puVar18 = local_fc0;
        puVar32 = local_fb0;
        uVar42 = local_f90;
        do {
          uVar25 = 0x40;
          if (uVar54 < 0x40) {
            uVar25 = uVar54;
          }
          lVar53 = uVar25 + (uVar25 == 0);
          lVar35 = 0;
          do {
            pHVar19 = (HistogramLiteral *)((long)local_ff0 + lVar35 * 0x410);
            memset(pHVar19,0,0x408);
            ((HistogramLiteral *)((long)local_ff0 + lVar35 * 0x410))->bit_cost_ = INFINITY;
            if (*(int *)((long)pvVar21 + ((long)local_fe0 + lVar35) * 4) != 0) {
              uVar25 = 0;
              do {
                pHVar19->data_[*(byte *)((long)local_fd8 + uVar25 + local_ff8)] =
                     pHVar19->data_[*(byte *)((long)local_fd8 + uVar25 + local_ff8)] + 1;
                uVar25 = uVar25 + 1;
                pHVar19->total_count_ = uVar25;
              } while (uVar25 < *(uint *)((long)pvVar21 + ((long)local_fe0 + lVar35) * 4));
              local_ff8 = local_ff8 + uVar25;
            }
            dVar56 = BrotliPopulationCostLiteral(pHVar19);
            pHVar19->bit_cost_ = dVar56;
            new_clusters[lVar35] = (uint32_t)lVar35;
            symbols[lVar35] = (uint32_t)lVar35;
            sizes[lVar35] = 1;
            lVar35 = lVar35 + 1;
          } while (lVar35 != lVar53);
          sVar40 = uVar46 - (long)local_fe0;
          if (0x3f < sVar40) {
            sVar40 = 0x40;
          }
          sVar40 = BrotliHistogramCombineLiteral
                             ((HistogramLiteral *)local_ff0,sizes,symbols,new_clusters,local_f68,
                              sVar40,sVar40,0x40,0x800);
          uVar25 = (long)local_fa8 + sVar40;
          if (local_f90 < uVar25) {
            uVar20 = local_f90;
            if (local_f90 == 0) {
              uVar20 = uVar25;
            }
            do {
              uVar34 = uVar20;
              uVar20 = uVar34 * 2;
            } while (uVar34 < uVar25);
            pHVar19 = (HistogramLiteral *)BrotliAllocate(m,uVar34 * 0x410);
            if (local_f90 != 0) {
              memcpy(pHVar19,local_1000,local_f90 * 0x410);
            }
            BrotliFree(m,local_1000);
            local_1000 = pHVar19;
            local_f90 = uVar34;
          }
          uVar20 = local_f80 + sVar40;
          uVar25 = uVar42;
          local_fb0 = puVar32;
          if (uVar42 < uVar20) {
            uVar34 = uVar42;
            if (uVar42 == 0) {
              uVar34 = uVar20;
            }
            do {
              uVar25 = uVar34;
              uVar34 = uVar25 * 2;
            } while (uVar25 < uVar20);
            local_fb0 = (uint32_t *)BrotliAllocate(m,uVar25 * 4);
            if (uVar42 != 0) {
              memcpy(local_fb0,puVar32,uVar42 << 2);
            }
            BrotliFree(m,puVar32);
          }
          if (sVar40 != 0) {
            pHVar19 = local_1000 + (long)local_fa8;
            sVar52 = 0;
            do {
              uVar50 = new_clusters[sVar52];
              memcpy(pHVar19,(HistogramLiteral *)((long)local_ff0 + (ulong)uVar50 * 0x410),0x410);
              local_fb0[local_f80 + sVar52] = sizes[uVar50];
              remap[new_clusters[sVar52]] = (uint32_t)sVar52;
              sVar52 = sVar52 + 1;
              pHVar19 = pHVar19 + 1;
            } while (sVar40 != sVar52);
            local_fa8 = (void *)((long)local_fa8 + sVar52);
            local_f80 = local_f80 + sVar52;
          }
          lVar35 = 0;
          do {
            puVar18[lVar35] = remap[symbols[lVar35]] + (int)uVar41;
            lVar35 = lVar35 + 1;
          } while (lVar53 != lVar35);
          uVar41 = uVar41 + sVar40;
          local_fe0 = (void *)((long)local_fe0 + 0x40);
          uVar54 = uVar54 - 0x40;
          puVar18 = puVar18 + 0x40;
          puVar32 = local_fb0;
          uVar42 = uVar25;
        } while (local_fe0 < uVar46);
      }
      BrotliFree(m,local_ff0);
      uVar54 = (uVar41 >> 1) * uVar41;
      if (uVar41 << 6 < uVar54) {
        uVar54 = uVar41 << 6;
      }
      if (0x800 < uVar54) {
        BrotliFree(m,local_f68);
        local_f68 = (HistogramPair *)BrotliAllocate(m,uVar54 * 0x18 + 0x18);
      }
      if (uVar41 == 0) {
        puVar18 = (uint32_t *)0x0;
      }
      else {
        puVar18 = (uint32_t *)BrotliAllocate(m,uVar41 * 4);
        auVar95 = _DAT_0016cba0;
        auVar64 = _DAT_0016bcd0;
        lVar53 = uVar41 - 1;
        auVar57._8_4_ = (int)lVar53;
        auVar57._0_8_ = lVar53;
        auVar57._12_4_ = (int)((ulong)lVar53 >> 0x20);
        uVar42 = 0;
        auVar57 = auVar57 ^ _DAT_0016bcd0;
        auVar65 = _DAT_0016bcc0;
        do {
          bVar4 = auVar57._0_4_ < SUB164(auVar65 ^ auVar64,0);
          iVar120 = auVar57._4_4_;
          iVar62 = SUB164(auVar65 ^ auVar64,4);
          if ((bool)(~(iVar120 < iVar62 || iVar62 == iVar120 && bVar4) & 1)) {
            puVar18[uVar42] = (uint32_t)uVar42;
          }
          if (iVar120 >= iVar62 && (iVar62 != iVar120 || !bVar4)) {
            puVar18[uVar42 + 1] = (uint32_t)uVar42 + 1;
          }
          uVar42 = uVar42 + 2;
          lVar53 = auVar65._8_8_;
          auVar65._0_8_ = auVar65._0_8_ + auVar95._0_8_;
          auVar65._8_8_ = lVar53 + auVar95._8_8_;
        } while ((uVar41 + 1 & 0xfffffffffffffffe) != uVar42);
      }
      sVar40 = BrotliHistogramCombineLiteral
                         (local_1000,local_fb0,local_fc0,puVar18,local_f68,uVar41,uVar46,0x100,
                          uVar54);
      BrotliFree(m,local_f68);
      BrotliFree(m,local_fb0);
      if (uVar41 == 0) {
        local_fd0 = (void *)0x0;
      }
      else {
        local_fd0 = BrotliAllocate(m,uVar41 << 2);
        memset(local_fd0,0xff,uVar41 << 2);
      }
      if (uVar46 != 0) {
        iVar120 = 0;
        uVar41 = 0;
        local_ff8 = 0;
        do {
          memset(local_b40,0,0x408);
          local_b40._1032_8_ = INFINITY;
          if (*(int *)((long)pvVar21 + uVar41 * 4) != 0) {
            uVar54 = 0;
            do {
              *(int *)(local_b40 + (ulong)*(byte *)((long)local_fd8 + uVar54 + local_ff8) * 4) =
                   *(int *)(local_b40 + (ulong)*(byte *)((long)local_fd8 + uVar54 + local_ff8) * 4)
                   + 1;
              uVar54 = uVar54 + 1;
            } while (uVar54 < *(uint *)((long)pvVar21 + uVar41 * 4));
            local_ff8 = local_ff8 + uVar54;
            local_b40._1024_8_ = uVar54;
          }
          lVar53 = 0;
          if (uVar41 != 0) {
            lVar53 = uVar41 - 1;
          }
          uVar50 = local_fc0[lVar53];
          uVar54 = (ulong)uVar50;
          local_ff0 = (HistogramCommand *)
                      BrotliHistogramBitCostDistanceLiteral
                                ((HistogramLiteral *)local_b40,local_1000 + uVar54);
          if (sVar40 != 0) {
            sVar52 = 0;
            do {
              dVar56 = BrotliHistogramBitCostDistanceLiteral
                                 ((HistogramLiteral *)local_b40,local_1000 + puVar18[sVar52]);
              if (dVar56 < (double)local_ff0) {
                uVar54 = (ulong)puVar18[sVar52];
                local_ff0 = (HistogramCommand *)dVar56;
              }
              uVar50 = (uint)uVar54;
              sVar52 = sVar52 + 1;
            } while (sVar40 != sVar52);
          }
          local_fc0[uVar41] = uVar50;
          if (*(int *)((long)local_fd0 + uVar54 * 4) == -1) {
            *(int *)((long)local_fd0 + uVar54 * 4) = iVar120;
            iVar120 = iVar120 + 1;
          }
          uVar41 = uVar41 + 1;
        } while (uVar41 != uVar46);
      }
      BrotliFree(m,puVar18);
      BrotliFree(m,local_1000);
      uVar41 = literal_split->types_alloc_size;
      if (uVar41 < uVar46) {
        if (uVar41 == 0) {
          uVar41 = uVar46;
        }
        do {
          uVar54 = uVar41;
          uVar41 = uVar54 * 2;
        } while (uVar54 < uVar46);
        puVar17 = (uint8_t *)BrotliAllocate(m,uVar54);
        if (literal_split->types_alloc_size != 0) {
          memcpy(puVar17,literal_split->types,literal_split->types_alloc_size);
        }
        BrotliFree(m,literal_split->types);
        literal_split->types = puVar17;
        literal_split->types_alloc_size = uVar54;
      }
      uVar41 = literal_split->lengths_alloc_size;
      if (uVar41 < uVar46) {
        if (uVar41 == 0) {
          uVar41 = uVar46;
        }
        do {
          uVar54 = uVar41;
          uVar41 = uVar54 * 2;
        } while (uVar54 < uVar46);
        puVar18 = (uint32_t *)BrotliAllocate(m,uVar54 * 4);
        if (literal_split->lengths_alloc_size != 0) {
          memcpy(puVar18,literal_split->lengths,literal_split->lengths_alloc_size << 2);
        }
        BrotliFree(m,literal_split->lengths);
        literal_split->lengths = puVar18;
        literal_split->lengths_alloc_size = uVar54;
LAB_0011d0b8:
        uVar50 = 0;
        sVar40 = 0;
        uVar47 = 0;
        uVar41 = 0;
        do {
          uVar47 = uVar47 + *(int *)((long)pvVar21 + uVar41 * 4);
          if ((uVar46 - 1 == uVar41) || (local_fc0[uVar41] != local_fc0[uVar41 + 1])) {
            uVar44 = uVar50 & 0xff;
            uVar3 = *(uint *)((long)local_fd0 + (ulong)local_fc0[uVar41] * 4);
            bVar45 = (byte)uVar3;
            literal_split->types[sVar40] = bVar45;
            bVar43 = (byte)uVar50;
            uVar50 = uVar3;
            if (bVar45 < bVar43) {
              uVar50 = uVar44;
            }
            literal_split->lengths[sVar40] = uVar47;
            sVar40 = sVar40 + 1;
            uVar47 = 0;
          }
          uVar41 = uVar41 + 1;
        } while (uVar46 != uVar41);
        sVar52 = (ulong)(uVar50 & 0xff) + 1;
      }
      else {
        if (uVar46 != 0) goto LAB_0011d0b8;
        sVar52 = 1;
        sVar40 = 0;
      }
      literal_split->num_blocks = sVar40;
      literal_split->num_types = sVar52;
      BrotliFree(m,local_fd0);
      BrotliFree(m,pvVar21);
      BrotliFree(m,local_fc0);
      BrotliFree(m,pvVar24);
    }
  }
  BrotliFree(m,local_fd8);
  if (num_commands == 0) {
    insert_and_copy_split->num_types = 1;
    pvVar21 = (void *)0x0;
    BrotliFree(m,(void *)0x0);
  }
  else {
    sVar40 = num_commands * 2;
    pvVar21 = BrotliAllocate(m,sVar40);
    puVar22 = &cmds->cmd_prefix_;
    sVar52 = 0;
    do {
      *(uint16_t *)((long)pvVar21 + sVar52 * 2) = *puVar22;
      sVar52 = sVar52 + 1;
      puVar22 = puVar22 + 8;
    } while (num_commands != sVar52);
    uVar41 = 0x32;
    if (num_commands < 0x6784) {
      uVar41 = (ulong)(((uint)num_commands & 0xffff) / 0x212 + 1);
    }
    if (num_commands < 0x80) {
      sVar52 = insert_and_copy_split->num_blocks;
      uVar54 = insert_and_copy_split->types_alloc_size;
      uVar41 = sVar52 + 1;
      if (uVar54 < uVar41) {
        if (uVar54 == 0) {
          uVar54 = uVar41;
        }
        do {
          uVar42 = uVar54;
          uVar54 = uVar42 * 2;
        } while (uVar42 < uVar41);
        puVar17 = (uint8_t *)BrotliAllocate(m,uVar42);
        if (insert_and_copy_split->types_alloc_size != 0) {
          memcpy(puVar17,insert_and_copy_split->types,insert_and_copy_split->types_alloc_size);
        }
        BrotliFree(m,insert_and_copy_split->types);
        insert_and_copy_split->types = puVar17;
        insert_and_copy_split->types_alloc_size = uVar42;
        sVar52 = insert_and_copy_split->num_blocks;
        uVar41 = sVar52 + 1;
      }
      uVar54 = insert_and_copy_split->lengths_alloc_size;
      if (uVar54 < uVar41) {
        if (uVar54 == 0) {
          uVar54 = uVar41;
        }
        do {
          uVar42 = uVar54;
          uVar54 = uVar42 * 2;
        } while (uVar42 < uVar41);
        puVar18 = (uint32_t *)BrotliAllocate(m,uVar42 * 4);
        if (insert_and_copy_split->lengths_alloc_size != 0) {
          memcpy(puVar18,insert_and_copy_split->lengths,
                 insert_and_copy_split->lengths_alloc_size << 2);
        }
        BrotliFree(m,insert_and_copy_split->lengths);
        insert_and_copy_split->lengths = puVar18;
        insert_and_copy_split->lengths_alloc_size = uVar42;
        sVar52 = insert_and_copy_split->num_blocks;
      }
      insert_and_copy_split->num_types = 1;
      insert_and_copy_split->types[sVar52] = '\0';
      sVar52 = insert_and_copy_split->num_blocks;
      insert_and_copy_split->lengths[sVar52] = (uint)num_commands;
      insert_and_copy_split->num_blocks = sVar52 + 1;
    }
    else {
      pvVar24 = BrotliAllocate(m,uVar41 * 0xb10);
      lVar53 = 0;
      do {
        memset((void *)((long)pvVar24 + lVar53),0,0xb08);
        *(undefined8 *)((long)pvVar24 + lVar53 + 0xb08) = 0x7ff0000000000000;
        lVar53 = lVar53 + 0xb10;
      } while (uVar41 * 0xb10 - lVar53 != 0);
      uVar42 = 0;
      uVar54 = 7;
      do {
        uVar46 = (uVar42 * num_commands) / uVar41;
        if (uVar42 != 0) {
          uVar54 = (ulong)(uint)((int)uVar54 * 0x41a7);
          uVar46 = uVar46 + uVar54 % (num_commands / uVar41);
        }
        if (num_commands <= uVar46 + 0x28) {
          uVar46 = num_commands - 0x29;
        }
        plVar2 = (long *)((long)pvVar24 + uVar42 * 0xb10 + 0xb00);
        *plVar2 = *plVar2 + 0x28;
        lVar53 = 0;
        do {
          piVar1 = (int *)((long)pvVar24 +
                          (ulong)*(ushort *)((long)pvVar21 + lVar53 * 2 + uVar46 * 2) * 4 +
                          uVar42 * 0xb10);
          *piVar1 = *piVar1 + 1;
          lVar53 = lVar53 + 1;
        } while (lVar53 != 0x28);
        uVar42 = uVar42 + 1;
      } while (uVar42 != uVar41);
      uVar54 = sVar40 / 0x28 + uVar41 + 99;
      if (uVar54 != uVar54 % uVar41) {
        uVar46 = 7;
        uVar42 = 0;
        do {
          memset(local_b40,0,0xb08);
          uVar46 = (ulong)(uint)((int)uVar46 * 0x41a7);
          puVar26 = (ushort *)((long)pvVar21 + (uVar46 % (num_commands - 0x27)) * 2);
          lVar53 = -0x28;
          do {
            uVar15 = *puVar26;
            puVar26 = puVar26 + 1;
            *(int *)(local_b40 + (ulong)uVar15 * 4) = *(int *)(local_b40 + (ulong)uVar15 * 4) + 1;
            lVar53 = lVar53 + 1;
          } while (lVar53 != 0);
          lVar53 = (uVar42 % uVar41) * 0xb10;
          plVar2 = (long *)((long)pvVar24 + lVar53 + 0xb00);
          *plVar2 = *plVar2 + 0x28;
          lVar35 = 0;
          do {
            lVar51 = lVar35 * 4;
            piVar1 = (int *)((long)pvVar24 + lVar35 * 4 + lVar53);
            auVar66._0_4_ = *piVar1 + *(int *)(local_b40 + lVar51);
            auVar66._4_4_ = piVar1[1] + *(int *)(local_b40 + lVar51 + 4);
            auVar66._8_4_ = piVar1[2] + *(int *)(local_b40 + lVar51 + 8);
            auVar66._12_4_ = piVar1[3] + *(int *)(local_b40 + lVar51 + 0xc);
            *(undefined1 (*) [16])((long)pvVar24 + lVar35 * 4 + lVar53) = auVar66;
            lVar35 = lVar35 + 4;
          } while (lVar35 != 0x2c0);
          uVar42 = uVar42 + 1;
        } while (uVar42 < uVar54 - uVar54 % uVar41);
      }
      pvVar27 = BrotliAllocate(m,num_commands);
      iVar120 = (int)uVar41;
      pvVar28 = BrotliAllocate(m,uVar41 * 0x1600);
      pvVar29 = BrotliAllocate(m,(ulong)(uint)(iVar120 * 8));
      sVar52 = (iVar120 + 7U >> 3) * num_commands;
      if (sVar52 == 0) {
        local_fa0 = (uint32_t *)0x0;
      }
      else {
        local_fa0 = (uint32_t *)BrotliAllocate(m,sVar52);
      }
      pvVar30 = BrotliAllocate(m,(ulong)(uint)(iVar120 * 2));
      lVar53 = 3;
      if (10 < params->quality) {
        lVar53 = 10;
      }
      lVar35 = 0;
      do {
        uVar54 = uVar41 + 7 >> 3;
        if (uVar41 < 2) {
          memset(pvVar27,0,num_commands);
          uVar42 = 1;
          auVar64 = _DAT_0016bcd0;
        }
        else {
          memset(pvVar28,0,uVar41 * 0x1600);
          uVar42 = 0;
          puVar37 = (uint *)((long)pvVar24 + 0xb00);
          do {
            uVar46 = (ulong)*puVar37;
            if (uVar46 < 0x100) {
              dVar56 = (double)kLog2Table[uVar46];
            }
            else {
              dVar56 = log2((double)uVar46);
            }
            *(double *)((long)pvVar28 + uVar42 * 8) = dVar56;
            uVar42 = uVar42 + 1;
            puVar37 = puVar37 + 0x2c4;
          } while (uVar41 != uVar42);
          pvVar38 = (void *)(uVar41 * 0x15f8 + (long)pvVar28);
          lVar51 = 0x2c0;
          puVar37 = (uint *)((long)pvVar24 + 0xafc);
          do {
            lVar51 = lVar51 + -1;
            uVar42 = 0;
            puVar49 = puVar37;
            do {
              dVar55 = -2.0;
              dVar56 = *(double *)((long)pvVar28 + uVar42 * 8);
              uVar46 = (ulong)*puVar49;
              if (uVar46 != 0) {
                if (*puVar49 < 0x100) {
                  dVar55 = (double)kLog2Table[uVar46];
                }
                else {
                  dVar55 = log2((double)uVar46);
                }
              }
              *(double *)((long)pvVar38 + uVar42 * 8) = dVar56 - dVar55;
              uVar42 = uVar42 + 1;
              puVar49 = puVar49 + 0x2c4;
            } while (uVar41 != uVar42);
            pvVar38 = (void *)((long)pvVar38 + uVar41 * -8);
            puVar37 = puVar37 + -1;
          } while (lVar51 != 0);
          memset(pvVar29,0,uVar41 * 8);
          memset(local_fa0,0,uVar54 * num_commands);
          auVar64 = _DAT_0016bcd0;
          uVar42 = 0;
          do {
            uVar15 = *(ushort *)((long)pvVar21 + uVar42 * 2);
            uVar46 = 0;
            dVar56 = 1e+99;
            do {
              dVar55 = *(double *)((long)pvVar28 + uVar46 * 8 + uVar15 * uVar41 * 8) +
                       *(double *)((long)pvVar29 + uVar46 * 8);
              *(double *)((long)pvVar29 + uVar46 * 8) = dVar55;
              if (dVar55 < dVar56) {
                *(char *)((long)pvVar27 + uVar42) = (char)uVar46;
                dVar56 = dVar55;
              }
              uVar46 = uVar46 + 1;
            } while (uVar41 != uVar46);
            dVar55 = 13.5;
            if (uVar42 < 2000) {
              dVar55 = (((double)(long)uVar42 * 0.07) / 2000.0 + 0.77) * 13.5;
            }
            uVar46 = 0;
            do {
              dVar72 = *(double *)((long)pvVar29 + uVar46 * 8) - dVar56;
              *(double *)((long)pvVar29 + uVar46 * 8) = dVar72;
              if (dVar55 <= dVar72) {
                *(double *)((long)pvVar29 + uVar46 * 8) = dVar55;
                pbVar36 = (byte *)((long)local_fa0 + (uVar46 >> 3) + uVar42 * uVar54);
                *pbVar36 = *pbVar36 | '\x01' << ((byte)uVar46 & 7);
              }
              uVar46 = uVar46 + 1;
            } while (uVar41 != uVar46);
            uVar42 = uVar42 + 1;
          } while (uVar42 != num_commands);
          bVar43 = *(byte *)((long)pvVar27 + (num_commands - 1));
          pvVar38 = (void *)((num_commands - 2) * uVar54 + (long)local_fa0);
          uVar42 = 1;
          sVar52 = num_commands;
          do {
            if ((*(byte *)((long)pvVar38 + (ulong)(bVar43 >> 3)) >> (bVar43 & 7) & 1) != 0) {
              bVar45 = *(byte *)((long)pvVar27 + (sVar52 - 2));
              uVar42 = uVar42 + (bVar43 != bVar45);
              bVar43 = bVar45;
            }
            *(byte *)((long)pvVar27 + (sVar52 - 2)) = bVar43;
            pvVar38 = (void *)((long)pvVar38 - uVar54);
            sVar52 = sVar52 - 1;
          } while (sVar52 != 1);
        }
        if (uVar41 != 0) {
          lVar51 = uVar41 - 1;
          auVar58._8_4_ = (int)lVar51;
          auVar58._0_8_ = lVar51;
          auVar58._12_4_ = (int)((ulong)lVar51 >> 0x20);
          auVar58 = auVar58 ^ auVar64;
          lVar51 = 0;
          auVar67 = _DAT_0016bcc0;
          auVar73 = _DAT_0016bcb0;
          auVar75 = _DAT_0016cb80;
          auVar77 = _DAT_0016cb70;
          do {
            auVar95 = auVar67 ^ auVar64;
            iVar120 = auVar58._0_4_;
            iVar119 = -(uint)(iVar120 < auVar95._0_4_);
            iVar62 = auVar58._4_4_;
            auVar88._4_4_ = -(uint)(iVar62 < auVar95._4_4_);
            iVar128 = auVar58._8_4_;
            iVar127 = -(uint)(iVar128 < auVar95._8_4_);
            iVar63 = auVar58._12_4_;
            auVar88._12_4_ = -(uint)(iVar63 < auVar95._12_4_);
            auVar110._4_4_ = iVar119;
            auVar110._0_4_ = iVar119;
            auVar110._8_4_ = iVar127;
            auVar110._12_4_ = iVar127;
            auVar133 = pshuflw(in_XMM8,auVar110,0xe8);
            auVar87._4_4_ = -(uint)(auVar95._4_4_ == iVar62);
            auVar87._12_4_ = -(uint)(auVar95._12_4_ == iVar63);
            auVar87._0_4_ = auVar87._4_4_;
            auVar87._8_4_ = auVar87._12_4_;
            auVar137 = pshuflw(in_XMM9,auVar87,0xe8);
            auVar88._0_4_ = auVar88._4_4_;
            auVar88._8_4_ = auVar88._12_4_;
            auVar95 = pshuflw(auVar133,auVar88,0xe8);
            auVar131._8_4_ = 0xffffffff;
            auVar131._0_8_ = 0xffffffffffffffff;
            auVar131._12_4_ = 0xffffffff;
            auVar131 = (auVar95 | auVar137 & auVar133) ^ auVar131;
            auVar95 = packssdw(auVar131,auVar131);
            if ((auVar95 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar30 + lVar51) = 0x100;
            }
            auVar88 = auVar87 & auVar110 | auVar88;
            auVar95 = packssdw(auVar88,auVar88);
            auVar9._8_4_ = 0xffffffff;
            auVar9._0_8_ = 0xffffffffffffffff;
            auVar9._12_4_ = 0xffffffff;
            auVar95 = packssdw(auVar95 ^ auVar9,auVar95 ^ auVar9);
            if ((auVar95._0_4_ >> 0x10 & 1) != 0) {
              *(undefined2 *)((long)pvVar30 + lVar51 + 2) = 0x100;
            }
            auVar95 = auVar73 ^ auVar64;
            iVar119 = -(uint)(iVar120 < auVar95._0_4_);
            auVar123._4_4_ = -(uint)(iVar62 < auVar95._4_4_);
            iVar127 = -(uint)(iVar128 < auVar95._8_4_);
            auVar123._12_4_ = -(uint)(iVar63 < auVar95._12_4_);
            auVar89._4_4_ = iVar119;
            auVar89._0_4_ = iVar119;
            auVar89._8_4_ = iVar127;
            auVar89._12_4_ = iVar127;
            auVar111._4_4_ = -(uint)(auVar95._4_4_ == iVar62);
            auVar111._12_4_ = -(uint)(auVar95._12_4_ == iVar63);
            auVar111._0_4_ = auVar111._4_4_;
            auVar111._8_4_ = auVar111._12_4_;
            auVar123._0_4_ = auVar123._4_4_;
            auVar123._8_4_ = auVar123._12_4_;
            auVar95 = auVar111 & auVar89 | auVar123;
            auVar95 = packssdw(auVar95,auVar95);
            auVar10._8_4_ = 0xffffffff;
            auVar10._0_8_ = 0xffffffffffffffff;
            auVar10._12_4_ = 0xffffffff;
            auVar95 = packssdw(auVar95 ^ auVar10,auVar95 ^ auVar10);
            if ((auVar95 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar30 + lVar51 + 4) = 0x100;
            }
            auVar99 = pshufhw(auVar89,auVar89,0x84);
            auVar116 = pshufhw(auVar111,auVar111,0x84);
            auVar100 = pshufhw(auVar99,auVar123,0x84);
            auVar90._8_4_ = 0xffffffff;
            auVar90._0_8_ = 0xffffffffffffffff;
            auVar90._12_4_ = 0xffffffff;
            auVar90 = (auVar100 | auVar116 & auVar99) ^ auVar90;
            auVar99 = packssdw(auVar90,auVar90);
            if ((auVar99 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar30 + lVar51 + 6) = 0x100;
            }
            auVar99 = auVar75 ^ auVar64;
            iVar119 = -(uint)(iVar120 < auVar99._0_4_);
            auVar92._4_4_ = -(uint)(iVar62 < auVar99._4_4_);
            iVar127 = -(uint)(iVar128 < auVar99._8_4_);
            auVar92._12_4_ = -(uint)(iVar63 < auVar99._12_4_);
            auVar112._4_4_ = iVar119;
            auVar112._0_4_ = iVar119;
            auVar112._8_4_ = iVar127;
            auVar112._12_4_ = iVar127;
            auVar95 = pshuflw(auVar95,auVar112,0xe8);
            auVar91._4_4_ = -(uint)(auVar99._4_4_ == iVar62);
            auVar91._12_4_ = -(uint)(auVar99._12_4_ == iVar63);
            auVar91._0_4_ = auVar91._4_4_;
            auVar91._8_4_ = auVar91._12_4_;
            in_XMM9 = pshuflw(auVar137 & auVar133,auVar91,0xe8);
            in_XMM9 = in_XMM9 & auVar95;
            auVar92._0_4_ = auVar92._4_4_;
            auVar92._8_4_ = auVar92._12_4_;
            auVar95 = pshuflw(auVar95,auVar92,0xe8);
            auVar132._8_4_ = 0xffffffff;
            auVar132._0_8_ = 0xffffffffffffffff;
            auVar132._12_4_ = 0xffffffff;
            auVar132 = (auVar95 | in_XMM9) ^ auVar132;
            auVar95 = packssdw(auVar132,auVar132);
            if ((auVar95 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar30 + lVar51 + 8) = 0x100;
            }
            auVar92 = auVar91 & auVar112 | auVar92;
            auVar95 = packssdw(auVar92,auVar92);
            auVar11._8_4_ = 0xffffffff;
            auVar11._0_8_ = 0xffffffffffffffff;
            auVar11._12_4_ = 0xffffffff;
            auVar95 = packssdw(auVar95 ^ auVar11,auVar95 ^ auVar11);
            if ((auVar95 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar30 + lVar51 + 10) = 0x100;
            }
            auVar95 = auVar77 ^ auVar64;
            iVar120 = -(uint)(iVar120 < auVar95._0_4_);
            auVar124._4_4_ = -(uint)(iVar62 < auVar95._4_4_);
            iVar128 = -(uint)(iVar128 < auVar95._8_4_);
            auVar124._12_4_ = -(uint)(iVar63 < auVar95._12_4_);
            auVar93._4_4_ = iVar120;
            auVar93._0_4_ = iVar120;
            auVar93._8_4_ = iVar128;
            auVar93._12_4_ = iVar128;
            auVar113._4_4_ = -(uint)(auVar95._4_4_ == iVar62);
            auVar113._12_4_ = -(uint)(auVar95._12_4_ == iVar63);
            auVar113._0_4_ = auVar113._4_4_;
            auVar113._8_4_ = auVar113._12_4_;
            auVar124._0_4_ = auVar124._4_4_;
            auVar124._8_4_ = auVar124._12_4_;
            auVar95 = auVar113 & auVar93 | auVar124;
            auVar95 = packssdw(auVar95,auVar95);
            auVar12._8_4_ = 0xffffffff;
            auVar12._0_8_ = 0xffffffffffffffff;
            auVar12._12_4_ = 0xffffffff;
            in_XMM8 = packssdw(auVar95 ^ auVar12,auVar95 ^ auVar12);
            if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar30 + lVar51 + 0xc) = 0x100;
            }
            auVar95 = pshufhw(auVar93,auVar93,0x84);
            auVar137 = pshufhw(auVar113,auVar113,0x84);
            auVar133 = pshufhw(auVar95,auVar124,0x84);
            auVar94._8_4_ = 0xffffffff;
            auVar94._0_8_ = 0xffffffffffffffff;
            auVar94._12_4_ = 0xffffffff;
            auVar94 = (auVar133 | auVar137 & auVar95) ^ auVar94;
            auVar95 = packssdw(auVar94,auVar94);
            if ((auVar95 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar30 + lVar51 + 0xe) = 0x100;
            }
            lVar48 = auVar67._8_8_;
            auVar67._0_8_ = auVar67._0_8_ + 8;
            auVar67._8_8_ = lVar48 + 8;
            lVar48 = auVar73._8_8_;
            auVar73._0_8_ = auVar73._0_8_ + 8;
            auVar73._8_8_ = lVar48 + 8;
            lVar48 = auVar75._8_8_;
            auVar75._0_8_ = auVar75._0_8_ + 8;
            auVar75._8_8_ = lVar48 + 8;
            lVar48 = auVar77._8_8_;
            auVar77._0_8_ = auVar77._0_8_ + 8;
            auVar77._8_8_ = lVar48 + 8;
            lVar51 = lVar51 + 0x10;
          } while (uVar54 * 0x10 != lVar51);
        }
        sVar52 = 0;
        uVar15 = 0;
        do {
          if (*(short *)((long)pvVar30 + (ulong)*(byte *)((long)pvVar27 + sVar52) * 2) == 0x100) {
            *(ushort *)((long)pvVar30 + (ulong)*(byte *)((long)pvVar27 + sVar52) * 2) = uVar15;
            uVar15 = uVar15 + 1;
          }
          sVar52 = sVar52 + 1;
        } while (num_commands != sVar52);
        sVar52 = 0;
        do {
          *(undefined1 *)((long)pvVar27 + sVar52) =
               *(undefined1 *)((long)pvVar30 + (ulong)*(byte *)((long)pvVar27 + sVar52) * 2);
          sVar52 = sVar52 + 1;
        } while (num_commands != sVar52);
        uVar41 = (ulong)uVar15;
        if (uVar15 != 0) {
          lVar51 = 0;
          do {
            memset((void *)((long)pvVar24 + lVar51),0,0xb08);
            *(undefined8 *)((long)pvVar24 + lVar51 + 0xb08) = 0x7ff0000000000000;
            lVar51 = lVar51 + 0xb10;
          } while (uVar41 * 0xb10 - lVar51 != 0);
        }
        sVar52 = 0;
        do {
          lVar51 = (ulong)*(byte *)((long)pvVar27 + sVar52) * 0xb10;
          piVar1 = (int *)((long)pvVar24 +
                          (ulong)*(ushort *)((long)pvVar21 + sVar52 * 2) * 4 + lVar51);
          *piVar1 = *piVar1 + 1;
          plVar2 = (long *)((long)pvVar24 + lVar51 + 0xb00);
          *plVar2 = *plVar2 + 1;
          sVar52 = sVar52 + 1;
        } while (num_commands != sVar52);
        lVar35 = lVar35 + 1;
      } while (lVar35 != lVar53);
      BrotliFree(m,pvVar28);
      BrotliFree(m,pvVar29);
      BrotliFree(m,local_fa0);
      BrotliFree(m,pvVar30);
      BrotliFree(m,pvVar24);
      if (uVar42 == 0) {
        out = (HistogramCommand *)BrotliAllocate(m,0xa5f0);
        puVar18 = (uint32_t *)BrotliAllocate(m,0x3c);
        local_f90 = 0xf;
        sVar52 = 0;
        pvVar24 = (void *)0x0;
        local_fc0 = (uint32_t *)0x0;
        local_ff0 = (HistogramCommand *)0x0;
      }
      else {
        sVar52 = uVar42 * 4;
        local_fc0 = (uint32_t *)BrotliAllocate(m,sVar52);
        pvVar24 = BrotliAllocate(m,sVar52);
        uVar41 = uVar42 * 0x10 + 0x3f0;
        local_f90 = uVar41 >> 6;
        if (uVar41 < 0x40) {
          puVar18 = (uint32_t *)0x0;
          out = (HistogramCommand *)0x0;
        }
        else {
          out = (HistogramCommand *)BrotliAllocate(m,local_f90 * 0xb10);
          puVar18 = (uint32_t *)BrotliAllocate(m,local_f90 * 4);
        }
        uVar41 = 0x40;
        if (uVar42 < 0x40) {
          uVar41 = uVar42;
        }
        local_ff0 = (HistogramCommand *)BrotliAllocate(m,uVar41 * 0xb10);
      }
      local_f68 = (HistogramPair *)BrotliAllocate(m,0xc018);
      lVar53 = 0;
      memset(sizes,0,0x100);
      memset(new_clusters,0,0x100);
      memset(symbols,0,0x100);
      memset(remap,0,0x100);
      memset(pvVar24,0,sVar52);
      sVar52 = 0;
      do {
        piVar1 = (int *)((long)pvVar24 + lVar53 * 4);
        *piVar1 = *piVar1 + 1;
        if ((num_commands - 1 == sVar52) ||
           (*(char *)((long)pvVar27 + sVar52) != *(char *)((long)pvVar27 + sVar52 + 1))) {
          lVar53 = lVar53 + 1;
        }
        sVar52 = sVar52 + 1;
      } while (num_commands != sVar52);
      if (uVar42 == 0) {
        local_f98 = 0;
      }
      else {
        local_fa8 = (void *)0x0;
        local_fa0 = local_fc0;
        local_f80 = 0;
        local_fd0 = (void *)0x0;
        local_f98 = 0;
        local_ff8 = 0;
        uVar41 = uVar42;
        uVar54 = local_f90;
        do {
          uVar46 = 0x40;
          if (uVar41 < 0x40) {
            uVar46 = uVar41;
          }
          lVar53 = uVar46 + (uVar46 == 0);
          lVar35 = 0;
          do {
            pHVar23 = local_ff0 + lVar35;
            memset(pHVar23,0,0xb08);
            local_ff0[lVar35].bit_cost_ = INFINITY;
            if (*(int *)((long)pvVar24 + ((long)local_fd0 + lVar35) * 4) != 0) {
              uVar46 = 0;
              do {
                pHVar23->data_[*(ushort *)((long)pvVar21 + uVar46 * 2 + local_ff8 * 2)] =
                     pHVar23->data_[*(ushort *)((long)pvVar21 + uVar46 * 2 + local_ff8 * 2)] + 1;
                uVar46 = uVar46 + 1;
              } while (uVar46 < *(uint *)((long)pvVar24 + ((long)local_fd0 + lVar35) * 4));
              pHVar23->total_count_ = uVar46;
              local_ff8 = local_ff8 + uVar46;
            }
            dVar56 = BrotliPopulationCostCommand(pHVar23);
            pHVar23->bit_cost_ = dVar56;
            new_clusters[lVar35] = (uint32_t)lVar35;
            symbols[lVar35] = (uint32_t)lVar35;
            sizes[lVar35] = 1;
            lVar35 = lVar35 + 1;
          } while (lVar35 != lVar53);
          sVar52 = uVar42 - (long)local_fd0;
          if (0x3f < sVar52) {
            sVar52 = 0x40;
          }
          sVar52 = BrotliHistogramCombineCommand
                             (local_ff0,sizes,symbols,new_clusters,local_f68,sVar52,sVar52,0x40,
                              0x800);
          uVar46 = (long)local_fa8 + sVar52;
          if (local_f90 < uVar46) {
            uVar25 = local_f90;
            if (local_f90 == 0) {
              uVar25 = uVar46;
            }
            do {
              uVar20 = uVar25;
              uVar25 = uVar20 * 2;
            } while (uVar20 < uVar46);
            pHVar23 = (HistogramCommand *)BrotliAllocate(m,uVar20 * 0xb10);
            if (local_f90 != 0) {
              memcpy(pHVar23,out,local_f90 * 0xb10);
            }
            BrotliFree(m,out);
            out = pHVar23;
            local_f90 = uVar20;
          }
          uVar46 = local_f80 + sVar52;
          if (uVar54 < uVar46) {
            uVar25 = uVar54;
            if (uVar54 == 0) {
              uVar25 = uVar46;
            }
            do {
              uVar20 = uVar25;
              uVar25 = uVar20 * 2;
            } while (uVar20 < uVar46);
            puVar32 = (uint32_t *)BrotliAllocate(m,uVar20 * 4);
            if (uVar54 != 0) {
              memcpy(puVar32,puVar18,uVar54 << 2);
            }
            BrotliFree(m,puVar18);
            puVar18 = puVar32;
            uVar54 = uVar20;
          }
          if (sVar52 != 0) {
            pHVar23 = out + (long)local_fa8;
            sVar39 = 0;
            do {
              uVar50 = new_clusters[sVar39];
              memcpy(pHVar23,local_ff0 + uVar50,0xb10);
              puVar18[local_f80 + sVar39] = sizes[uVar50];
              remap[new_clusters[sVar39]] = (uint32_t)sVar39;
              sVar39 = sVar39 + 1;
              pHVar23 = pHVar23 + 1;
            } while (sVar52 != sVar39);
            local_fa8 = (void *)((long)local_fa8 + sVar39);
            local_f80 = local_f80 + sVar39;
          }
          lVar35 = 0;
          do {
            local_fa0[lVar35] = remap[symbols[lVar35]] + (int)local_f98;
            lVar35 = lVar35 + 1;
          } while (lVar53 != lVar35);
          local_f98 = local_f98 + sVar52;
          local_fd0 = (void *)((long)local_fd0 + 0x40);
          uVar41 = uVar41 - 0x40;
          local_fa0 = local_fa0 + 0x40;
        } while (local_fd0 < uVar42);
      }
      BrotliFree(m,local_ff0);
      uVar41 = (local_f98 >> 1) * local_f98;
      if (local_f98 << 6 < uVar41) {
        uVar41 = local_f98 << 6;
      }
      if (0x800 < uVar41) {
        BrotliFree(m,local_f68);
        local_f68 = (HistogramPair *)BrotliAllocate(m,uVar41 * 0x18 + 0x18);
      }
      if (local_f98 == 0) {
        puVar32 = (uint32_t *)0x0;
      }
      else {
        puVar32 = (uint32_t *)BrotliAllocate(m,local_f98 * 4);
        auVar95 = _DAT_0016cba0;
        auVar64 = _DAT_0016bcd0;
        lVar53 = local_f98 - 1;
        auVar59._8_4_ = (int)lVar53;
        auVar59._0_8_ = lVar53;
        auVar59._12_4_ = (int)((ulong)lVar53 >> 0x20);
        uVar54 = 0;
        auVar59 = auVar59 ^ _DAT_0016bcd0;
        auVar68 = _DAT_0016bcc0;
        do {
          bVar4 = auVar59._0_4_ < SUB164(auVar68 ^ auVar64,0);
          iVar120 = auVar59._4_4_;
          iVar62 = SUB164(auVar68 ^ auVar64,4);
          if ((bool)(~(iVar120 < iVar62 || iVar62 == iVar120 && bVar4) & 1)) {
            puVar32[uVar54] = (uint32_t)uVar54;
          }
          if (iVar120 >= iVar62 && (iVar62 != iVar120 || !bVar4)) {
            puVar32[uVar54 + 1] = (uint32_t)uVar54 + 1;
          }
          uVar54 = uVar54 + 2;
          lVar53 = auVar68._8_8_;
          auVar68._0_8_ = auVar68._0_8_ + auVar95._0_8_;
          auVar68._8_8_ = lVar53 + auVar95._8_8_;
        } while ((local_f98 + 1 & 0xfffffffffffffffe) != uVar54);
      }
      sVar52 = BrotliHistogramCombineCommand
                         (out,puVar18,local_fc0,puVar32,local_f68,local_f98,uVar42,0x100,uVar41);
      BrotliFree(m,local_f68);
      BrotliFree(m,puVar18);
      if (local_f98 == 0) {
        local_fd0 = (void *)0x0;
      }
      else {
        local_fd0 = BrotliAllocate(m,local_f98 << 2);
        memset(local_fd0,0xff,local_f98 << 2);
      }
      if (uVar42 != 0) {
        iVar120 = 0;
        uVar41 = 0;
        local_ff8 = 0;
        do {
          memset(local_b40,0,0xb08);
          local_38 = INFINITY;
          if (*(int *)((long)pvVar24 + uVar41 * 4) != 0) {
            uVar54 = 0;
            do {
              *(int *)(local_b40 +
                      (ulong)*(ushort *)((long)pvVar21 + uVar54 * 2 + local_ff8 * 2) * 4) =
                   *(int *)(local_b40 +
                           (ulong)*(ushort *)((long)pvVar21 + uVar54 * 2 + local_ff8 * 2) * 4) + 1;
              uVar54 = uVar54 + 1;
            } while (uVar54 < *(uint *)((long)pvVar24 + uVar41 * 4));
            local_ff8 = local_ff8 + uVar54;
            local_40 = uVar54;
          }
          lVar53 = 0;
          if (uVar41 != 0) {
            lVar53 = uVar41 - 1;
          }
          uVar50 = local_fc0[lVar53];
          uVar54 = (ulong)uVar50;
          local_ff0 = (HistogramCommand *)
                      BrotliHistogramBitCostDistanceCommand
                                ((HistogramCommand *)local_b40,out + uVar54);
          if (sVar52 != 0) {
            sVar39 = 0;
            do {
              dVar56 = BrotliHistogramBitCostDistanceCommand
                                 ((HistogramCommand *)local_b40,out + puVar32[sVar39]);
              if (dVar56 < (double)local_ff0) {
                uVar54 = (ulong)puVar32[sVar39];
                local_ff0 = (HistogramCommand *)dVar56;
              }
              uVar50 = (uint)uVar54;
              sVar39 = sVar39 + 1;
            } while (sVar52 != sVar39);
          }
          local_fc0[uVar41] = uVar50;
          if (*(int *)((long)local_fd0 + uVar54 * 4) == -1) {
            *(int *)((long)local_fd0 + uVar54 * 4) = iVar120;
            iVar120 = iVar120 + 1;
          }
          uVar41 = uVar41 + 1;
        } while (uVar41 != uVar42);
      }
      BrotliFree(m,puVar32);
      BrotliFree(m,out);
      uVar41 = insert_and_copy_split->types_alloc_size;
      if (uVar41 < uVar42) {
        if (uVar41 == 0) {
          uVar41 = uVar42;
        }
        do {
          uVar54 = uVar41;
          uVar41 = uVar54 * 2;
        } while (uVar54 < uVar42);
        puVar17 = (uint8_t *)BrotliAllocate(m,uVar54);
        if (insert_and_copy_split->types_alloc_size != 0) {
          memcpy(puVar17,insert_and_copy_split->types,insert_and_copy_split->types_alloc_size);
        }
        BrotliFree(m,insert_and_copy_split->types);
        insert_and_copy_split->types = puVar17;
        insert_and_copy_split->types_alloc_size = uVar54;
      }
      uVar41 = insert_and_copy_split->lengths_alloc_size;
      if (uVar41 < uVar42) {
        if (uVar41 == 0) {
          uVar41 = uVar42;
        }
        do {
          uVar54 = uVar41;
          uVar41 = uVar54 * 2;
        } while (uVar54 < uVar42);
        puVar18 = (uint32_t *)BrotliAllocate(m,uVar54 * 4);
        if (insert_and_copy_split->lengths_alloc_size != 0) {
          memcpy(puVar18,insert_and_copy_split->lengths,
                 insert_and_copy_split->lengths_alloc_size << 2);
        }
        BrotliFree(m,insert_and_copy_split->lengths);
        insert_and_copy_split->lengths = puVar18;
        insert_and_copy_split->lengths_alloc_size = uVar54;
LAB_0011e59e:
        uVar50 = 0;
        sVar52 = 0;
        uVar47 = 0;
        uVar41 = 0;
        do {
          uVar47 = uVar47 + *(int *)((long)pvVar24 + uVar41 * 4);
          if ((uVar42 - 1 == uVar41) || (local_fc0[uVar41] != local_fc0[uVar41 + 1])) {
            uVar44 = uVar50 & 0xff;
            uVar3 = *(uint *)((long)local_fd0 + (ulong)local_fc0[uVar41] * 4);
            bVar45 = (byte)uVar3;
            insert_and_copy_split->types[sVar52] = bVar45;
            bVar43 = (byte)uVar50;
            uVar50 = uVar3;
            if (bVar45 < bVar43) {
              uVar50 = uVar44;
            }
            insert_and_copy_split->lengths[sVar52] = uVar47;
            sVar52 = sVar52 + 1;
            uVar47 = 0;
          }
          uVar41 = uVar41 + 1;
        } while (uVar42 != uVar41);
        sVar39 = (ulong)(uVar50 & 0xff) + 1;
      }
      else {
        if (uVar42 != 0) goto LAB_0011e59e;
        sVar39 = 1;
        sVar52 = 0;
      }
      insert_and_copy_split->num_blocks = sVar52;
      insert_and_copy_split->num_types = sVar39;
      BrotliFree(m,local_fd0);
      BrotliFree(m,pvVar24);
      BrotliFree(m,local_fc0);
      BrotliFree(m,pvVar27);
    }
    BrotliFree(m,pvVar21);
    pvVar21 = BrotliAllocate(m,sVar40);
    if (num_commands != 0) {
      puVar22 = &cmds->dist_prefix_;
      uVar41 = 0;
      do {
        if (((*(uint *)(puVar22 + -5) & 0x1ffffff) != 0) && (0x7f < puVar22[-1])) {
          *(uint16_t *)((long)pvVar21 + uVar41 * 2) = *puVar22 & 0x3ff;
          uVar41 = uVar41 + 1;
        }
        puVar22 = puVar22 + 8;
        num_commands = num_commands - 1;
      } while (num_commands != 0);
      uVar54 = 0x32;
      if (uVar41 < 0x6a40) {
        uVar54 = (ulong)(((uint)uVar41 & 0xffff) / 0x220 + 1);
      }
      if (uVar41 != 0) {
        if (uVar41 < 0x80) {
          sVar40 = dist_split->num_blocks;
          uVar42 = dist_split->types_alloc_size;
          uVar54 = sVar40 + 1;
          if (uVar42 < uVar54) {
            if (uVar42 == 0) {
              uVar42 = uVar54;
            }
            do {
              uVar46 = uVar42;
              uVar42 = uVar46 * 2;
            } while (uVar46 < uVar54);
            puVar17 = (uint8_t *)BrotliAllocate(m,uVar46);
            if (dist_split->types_alloc_size != 0) {
              memcpy(puVar17,dist_split->types,dist_split->types_alloc_size);
            }
            BrotliFree(m,dist_split->types);
            dist_split->types = puVar17;
            dist_split->types_alloc_size = uVar46;
            sVar40 = dist_split->num_blocks;
            uVar54 = sVar40 + 1;
          }
          uVar42 = dist_split->lengths_alloc_size;
          if (uVar42 < uVar54) {
            if (uVar42 == 0) {
              uVar42 = uVar54;
            }
            do {
              uVar46 = uVar42;
              uVar42 = uVar46 * 2;
            } while (uVar46 < uVar54);
            puVar18 = (uint32_t *)BrotliAllocate(m,uVar46 * 4);
            if (dist_split->lengths_alloc_size != 0) {
              memcpy(puVar18,dist_split->lengths,dist_split->lengths_alloc_size << 2);
            }
            BrotliFree(m,dist_split->lengths);
            dist_split->lengths = puVar18;
            dist_split->lengths_alloc_size = uVar46;
            sVar40 = dist_split->num_blocks;
          }
          dist_split->num_types = 1;
          dist_split->types[sVar40] = '\0';
          sVar40 = dist_split->num_blocks;
          dist_split->lengths[sVar40] = (uint)uVar41;
          dist_split->num_blocks = sVar40 + 1;
          goto LAB_0011e7d7;
        }
        pvVar24 = BrotliAllocate(m,uVar54 * 0x890);
        lVar53 = 0;
        do {
          memset((void *)(lVar53 + (long)pvVar24),0,0x888);
          *(undefined8 *)((long)pvVar24 + lVar53 + 0x888) = 0x7ff0000000000000;
          lVar53 = lVar53 + 0x890;
        } while (uVar54 * 0x890 - lVar53 != 0);
        uVar46 = 0;
        uVar42 = 7;
        do {
          uVar25 = (uVar46 * uVar41) / uVar54;
          if (uVar46 != 0) {
            uVar42 = (ulong)(uint)((int)uVar42 * 0x41a7);
            uVar25 = uVar25 + uVar42 % (uVar41 / uVar54);
          }
          if (uVar41 <= uVar25 + 0x28) {
            uVar25 = uVar41 - 0x29;
          }
          plVar2 = (long *)((long)pvVar24 + uVar46 * 0x890 + 0x880);
          *plVar2 = *plVar2 + 0x28;
          lVar53 = 0;
          do {
            piVar1 = (int *)((long)pvVar24 +
                            (ulong)*(ushort *)((long)pvVar21 + lVar53 * 2 + uVar25 * 2) * 4 +
                            uVar46 * 0x890);
            *piVar1 = *piVar1 + 1;
            lVar53 = lVar53 + 1;
          } while (lVar53 != 0x28);
          uVar46 = uVar46 + 1;
        } while (uVar46 != uVar54);
        uVar42 = (uVar41 * 2) / 0x28 + uVar54 + 99;
        if (uVar42 != uVar42 % uVar54) {
          uVar25 = 7;
          uVar46 = 0;
          do {
            memset(local_b40,0,0x888);
            uVar25 = (ulong)(uint)((int)uVar25 * 0x41a7);
            puVar26 = (ushort *)((long)pvVar21 + (uVar25 % (uVar41 - 0x27)) * 2);
            lVar53 = -0x28;
            do {
              uVar15 = *puVar26;
              puVar26 = puVar26 + 1;
              *(int *)(local_b40 + (ulong)uVar15 * 4) = *(int *)(local_b40 + (ulong)uVar15 * 4) + 1;
              lVar53 = lVar53 + 1;
            } while (lVar53 != 0);
            lVar53 = (uVar46 % uVar54) * 0x890;
            plVar2 = (long *)((long)pvVar24 + lVar53 + 0x880);
            *plVar2 = *plVar2 + 0x28;
            lVar35 = 0;
            do {
              lVar51 = lVar35 * 4;
              piVar1 = (int *)((long)pvVar24 + lVar35 * 4 + lVar53);
              auVar69._0_4_ = *piVar1 + *(int *)(local_b40 + lVar51);
              auVar69._4_4_ = piVar1[1] + *(int *)(local_b40 + lVar51 + 4);
              auVar69._8_4_ = piVar1[2] + *(int *)(local_b40 + lVar51 + 8);
              auVar69._12_4_ = piVar1[3] + *(int *)(local_b40 + lVar51 + 0xc);
              *(undefined1 (*) [16])((long)pvVar24 + lVar35 * 4 + lVar53) = auVar69;
              lVar35 = lVar35 + 4;
            } while (lVar35 != 0x220);
            uVar46 = uVar46 + 1;
          } while (uVar46 < uVar42 - uVar42 % uVar54);
        }
        pvVar27 = BrotliAllocate(m,uVar41);
        iVar120 = (int)uVar54;
        pvVar28 = BrotliAllocate(m,uVar54 * 0x1100);
        pvVar29 = BrotliAllocate(m,(ulong)(uint)(iVar120 * 8));
        sVar40 = (iVar120 + 7U >> 3) * uVar41;
        if (sVar40 == 0) {
          local_fa0 = (uint32_t *)0x0;
        }
        else {
          local_fa0 = (uint32_t *)BrotliAllocate(m,sVar40);
        }
        pvVar30 = BrotliAllocate(m,(ulong)(uint)(iVar120 * 2));
        lVar53 = 3;
        if (10 < params->quality) {
          lVar53 = 10;
        }
        lVar35 = 0;
        do {
          uVar42 = uVar54 + 7 >> 3;
          if (uVar54 < 2) {
            memset(pvVar27,0,uVar41);
            uVar25 = 1;
            auVar64 = _DAT_0016bcd0;
          }
          else {
            memset(pvVar28,0,uVar54 * 0x1100);
            uVar46 = 0;
            puVar37 = (uint *)((long)pvVar24 + 0x880);
            do {
              uVar25 = (ulong)*puVar37;
              if (uVar25 < 0x100) {
                dVar56 = (double)kLog2Table[uVar25];
              }
              else {
                dVar56 = log2((double)uVar25);
              }
              *(double *)((long)pvVar28 + uVar46 * 8) = dVar56;
              uVar46 = uVar46 + 1;
              puVar37 = puVar37 + 0x224;
            } while (uVar54 != uVar46);
            pvVar38 = (void *)(uVar54 * 0x10f8 + (long)pvVar28);
            lVar51 = 0x220;
            puVar37 = (uint *)((long)pvVar24 + 0x87c);
            do {
              lVar51 = lVar51 + -1;
              uVar46 = 0;
              puVar49 = puVar37;
              do {
                dVar55 = -2.0;
                dVar56 = *(double *)((long)pvVar28 + uVar46 * 8);
                uVar25 = (ulong)*puVar49;
                if (uVar25 != 0) {
                  if (*puVar49 < 0x100) {
                    dVar55 = (double)kLog2Table[uVar25];
                  }
                  else {
                    dVar55 = log2((double)uVar25);
                  }
                }
                *(double *)((long)pvVar38 + uVar46 * 8) = dVar56 - dVar55;
                uVar46 = uVar46 + 1;
                puVar49 = puVar49 + 0x224;
              } while (uVar54 != uVar46);
              pvVar38 = (void *)((long)pvVar38 + uVar54 * -8);
              puVar37 = puVar37 + -1;
            } while (lVar51 != 0);
            memset(pvVar29,0,uVar54 * 8);
            memset(local_fa0,0,uVar42 * uVar41);
            auVar64 = _DAT_0016bcd0;
            uVar46 = 0;
            do {
              uVar15 = *(ushort *)((long)pvVar21 + uVar46 * 2);
              uVar25 = 0;
              dVar56 = 1e+99;
              do {
                dVar55 = *(double *)((long)pvVar28 + uVar25 * 8 + uVar15 * uVar54 * 8) +
                         *(double *)((long)pvVar29 + uVar25 * 8);
                *(double *)((long)pvVar29 + uVar25 * 8) = dVar55;
                if (dVar55 < dVar56) {
                  *(char *)((long)pvVar27 + uVar46) = (char)uVar25;
                  dVar56 = dVar55;
                }
                uVar25 = uVar25 + 1;
              } while (uVar54 != uVar25);
              dVar55 = 14.6;
              if (uVar46 < 2000) {
                dVar55 = (((double)(long)uVar46 * 0.07) / 2000.0 + 0.77) * 14.6;
              }
              uVar25 = 0;
              do {
                dVar72 = *(double *)((long)pvVar29 + uVar25 * 8) - dVar56;
                *(double *)((long)pvVar29 + uVar25 * 8) = dVar72;
                if (dVar55 <= dVar72) {
                  *(double *)((long)pvVar29 + uVar25 * 8) = dVar55;
                  pbVar36 = (byte *)((long)local_fa0 + (uVar25 >> 3) + uVar46 * uVar42);
                  *pbVar36 = *pbVar36 | '\x01' << ((byte)uVar25 & 7);
                }
                uVar25 = uVar25 + 1;
              } while (uVar54 != uVar25);
              uVar46 = uVar46 + 1;
            } while (uVar46 != uVar41);
            bVar43 = *(byte *)((long)pvVar27 + (uVar41 - 1));
            pvVar38 = (void *)((uVar41 - 2) * uVar42 + (long)local_fa0);
            uVar25 = 1;
            uVar46 = uVar41;
            do {
              if ((*(byte *)((long)pvVar38 + (ulong)(bVar43 >> 3)) >> (bVar43 & 7) & 1) != 0) {
                bVar45 = *(byte *)((long)pvVar27 + (uVar46 - 2));
                uVar25 = uVar25 + (bVar43 != bVar45);
                bVar43 = bVar45;
              }
              *(byte *)((long)pvVar27 + (uVar46 - 2)) = bVar43;
              pvVar38 = (void *)((long)pvVar38 - uVar42);
              uVar46 = uVar46 - 1;
            } while (uVar46 != 1);
          }
          if (uVar54 != 0) {
            lVar51 = uVar54 - 1;
            auVar60._8_4_ = (int)lVar51;
            auVar60._0_8_ = lVar51;
            auVar60._12_4_ = (int)((ulong)lVar51 >> 0x20);
            auVar60 = auVar60 ^ auVar64;
            lVar51 = 0;
            auVar70 = _DAT_0016bcc0;
            auVar74 = _DAT_0016bcb0;
            auVar76 = _DAT_0016cb80;
            auVar78 = _DAT_0016cb70;
            do {
              auVar95 = auVar70 ^ auVar64;
              iVar120 = auVar60._0_4_;
              iVar119 = -(uint)(iVar120 < auVar95._0_4_);
              iVar62 = auVar60._4_4_;
              auVar97._4_4_ = -(uint)(iVar62 < auVar95._4_4_);
              iVar128 = auVar60._8_4_;
              iVar127 = -(uint)(iVar128 < auVar95._8_4_);
              iVar63 = auVar60._12_4_;
              auVar97._12_4_ = -(uint)(iVar63 < auVar95._12_4_);
              auVar114._4_4_ = iVar119;
              auVar114._0_4_ = iVar119;
              auVar114._8_4_ = iVar127;
              auVar114._12_4_ = iVar127;
              auVar133 = pshuflw(in_XMM8,auVar114,0xe8);
              auVar96._4_4_ = -(uint)(auVar95._4_4_ == iVar62);
              auVar96._12_4_ = -(uint)(auVar95._12_4_ == iVar63);
              auVar96._0_4_ = auVar96._4_4_;
              auVar96._8_4_ = auVar96._12_4_;
              auVar137 = pshuflw(in_XMM9,auVar96,0xe8);
              auVar97._0_4_ = auVar97._4_4_;
              auVar97._8_4_ = auVar97._12_4_;
              auVar95 = pshuflw(auVar133,auVar97,0xe8);
              auVar134._8_4_ = 0xffffffff;
              auVar134._0_8_ = 0xffffffffffffffff;
              auVar134._12_4_ = 0xffffffff;
              auVar134 = (auVar95 | auVar137 & auVar133) ^ auVar134;
              auVar95 = packssdw(auVar134,auVar134);
              if ((auVar95 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)((long)pvVar30 + lVar51) = 0x100;
              }
              auVar97 = auVar96 & auVar114 | auVar97;
              auVar95 = packssdw(auVar97,auVar97);
              auVar5._8_4_ = 0xffffffff;
              auVar5._0_8_ = 0xffffffffffffffff;
              auVar5._12_4_ = 0xffffffff;
              auVar95 = packssdw(auVar95 ^ auVar5,auVar95 ^ auVar5);
              if ((auVar95._0_4_ >> 0x10 & 1) != 0) {
                *(undefined2 *)((long)pvVar30 + lVar51 + 2) = 0x100;
              }
              auVar95 = auVar74 ^ auVar64;
              iVar119 = -(uint)(iVar120 < auVar95._0_4_);
              auVar125._4_4_ = -(uint)(iVar62 < auVar95._4_4_);
              iVar127 = -(uint)(iVar128 < auVar95._8_4_);
              auVar125._12_4_ = -(uint)(iVar63 < auVar95._12_4_);
              auVar98._4_4_ = iVar119;
              auVar98._0_4_ = iVar119;
              auVar98._8_4_ = iVar127;
              auVar98._12_4_ = iVar127;
              auVar115._4_4_ = -(uint)(auVar95._4_4_ == iVar62);
              auVar115._12_4_ = -(uint)(auVar95._12_4_ == iVar63);
              auVar115._0_4_ = auVar115._4_4_;
              auVar115._8_4_ = auVar115._12_4_;
              auVar125._0_4_ = auVar125._4_4_;
              auVar125._8_4_ = auVar125._12_4_;
              auVar95 = auVar115 & auVar98 | auVar125;
              auVar95 = packssdw(auVar95,auVar95);
              auVar6._8_4_ = 0xffffffff;
              auVar6._0_8_ = 0xffffffffffffffff;
              auVar6._12_4_ = 0xffffffff;
              auVar95 = packssdw(auVar95 ^ auVar6,auVar95 ^ auVar6);
              if ((auVar95 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                *(undefined2 *)((long)pvVar30 + lVar51 + 4) = 0x100;
              }
              auVar99 = pshufhw(auVar98,auVar98,0x84);
              auVar116 = pshufhw(auVar115,auVar115,0x84);
              auVar100 = pshufhw(auVar99,auVar125,0x84);
              auVar101._8_4_ = 0xffffffff;
              auVar101._0_8_ = 0xffffffffffffffff;
              auVar101._12_4_ = 0xffffffff;
              auVar101 = (auVar100 | auVar116 & auVar99) ^ auVar101;
              auVar99 = packssdw(auVar101,auVar101);
              if ((auVar99 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *(undefined2 *)((long)pvVar30 + lVar51 + 6) = 0x100;
              }
              auVar99 = auVar76 ^ auVar64;
              iVar119 = -(uint)(iVar120 < auVar99._0_4_);
              auVar103._4_4_ = -(uint)(iVar62 < auVar99._4_4_);
              iVar127 = -(uint)(iVar128 < auVar99._8_4_);
              auVar103._12_4_ = -(uint)(iVar63 < auVar99._12_4_);
              auVar117._4_4_ = iVar119;
              auVar117._0_4_ = iVar119;
              auVar117._8_4_ = iVar127;
              auVar117._12_4_ = iVar127;
              auVar95 = pshuflw(auVar95,auVar117,0xe8);
              auVar102._4_4_ = -(uint)(auVar99._4_4_ == iVar62);
              auVar102._12_4_ = -(uint)(auVar99._12_4_ == iVar63);
              auVar102._0_4_ = auVar102._4_4_;
              auVar102._8_4_ = auVar102._12_4_;
              in_XMM9 = pshuflw(auVar137 & auVar133,auVar102,0xe8);
              in_XMM9 = in_XMM9 & auVar95;
              auVar103._0_4_ = auVar103._4_4_;
              auVar103._8_4_ = auVar103._12_4_;
              auVar95 = pshuflw(auVar95,auVar103,0xe8);
              auVar135._8_4_ = 0xffffffff;
              auVar135._0_8_ = 0xffffffffffffffff;
              auVar135._12_4_ = 0xffffffff;
              auVar135 = (auVar95 | in_XMM9) ^ auVar135;
              auVar95 = packssdw(auVar135,auVar135);
              if ((auVar95 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)((long)pvVar30 + lVar51 + 8) = 0x100;
              }
              auVar103 = auVar102 & auVar117 | auVar103;
              auVar95 = packssdw(auVar103,auVar103);
              auVar7._8_4_ = 0xffffffff;
              auVar7._0_8_ = 0xffffffffffffffff;
              auVar7._12_4_ = 0xffffffff;
              auVar95 = packssdw(auVar95 ^ auVar7,auVar95 ^ auVar7);
              if ((auVar95 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                *(undefined2 *)((long)pvVar30 + lVar51 + 10) = 0x100;
              }
              auVar95 = auVar78 ^ auVar64;
              iVar120 = -(uint)(iVar120 < auVar95._0_4_);
              auVar126._4_4_ = -(uint)(iVar62 < auVar95._4_4_);
              iVar128 = -(uint)(iVar128 < auVar95._8_4_);
              auVar126._12_4_ = -(uint)(iVar63 < auVar95._12_4_);
              auVar104._4_4_ = iVar120;
              auVar104._0_4_ = iVar120;
              auVar104._8_4_ = iVar128;
              auVar104._12_4_ = iVar128;
              auVar118._4_4_ = -(uint)(auVar95._4_4_ == iVar62);
              auVar118._12_4_ = -(uint)(auVar95._12_4_ == iVar63);
              auVar118._0_4_ = auVar118._4_4_;
              auVar118._8_4_ = auVar118._12_4_;
              auVar126._0_4_ = auVar126._4_4_;
              auVar126._8_4_ = auVar126._12_4_;
              auVar95 = auVar118 & auVar104 | auVar126;
              auVar95 = packssdw(auVar95,auVar95);
              auVar8._8_4_ = 0xffffffff;
              auVar8._0_8_ = 0xffffffffffffffff;
              auVar8._12_4_ = 0xffffffff;
              in_XMM8 = packssdw(auVar95 ^ auVar8,auVar95 ^ auVar8);
              if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                *(undefined2 *)((long)pvVar30 + lVar51 + 0xc) = 0x100;
              }
              auVar95 = pshufhw(auVar104,auVar104,0x84);
              auVar137 = pshufhw(auVar118,auVar118,0x84);
              auVar133 = pshufhw(auVar95,auVar126,0x84);
              auVar105._8_4_ = 0xffffffff;
              auVar105._0_8_ = 0xffffffffffffffff;
              auVar105._12_4_ = 0xffffffff;
              auVar105 = (auVar133 | auVar137 & auVar95) ^ auVar105;
              auVar95 = packssdw(auVar105,auVar105);
              if ((auVar95 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *(undefined2 *)((long)pvVar30 + lVar51 + 0xe) = 0x100;
              }
              lVar48 = auVar70._8_8_;
              auVar70._0_8_ = auVar70._0_8_ + 8;
              auVar70._8_8_ = lVar48 + 8;
              lVar48 = auVar74._8_8_;
              auVar74._0_8_ = auVar74._0_8_ + 8;
              auVar74._8_8_ = lVar48 + 8;
              lVar48 = auVar76._8_8_;
              auVar76._0_8_ = auVar76._0_8_ + 8;
              auVar76._8_8_ = lVar48 + 8;
              lVar48 = auVar78._8_8_;
              auVar78._0_8_ = auVar78._0_8_ + 8;
              auVar78._8_8_ = lVar48 + 8;
              lVar51 = lVar51 + 0x10;
            } while (uVar42 * 0x10 != lVar51);
          }
          uVar54 = 0;
          uVar15 = 0;
          do {
            if (*(short *)((long)pvVar30 + (ulong)*(byte *)((long)pvVar27 + uVar54) * 2) == 0x100) {
              *(ushort *)((long)pvVar30 + (ulong)*(byte *)((long)pvVar27 + uVar54) * 2) = uVar15;
              uVar15 = uVar15 + 1;
            }
            uVar54 = uVar54 + 1;
          } while (uVar41 != uVar54);
          uVar54 = 0;
          do {
            *(undefined1 *)((long)pvVar27 + uVar54) =
                 *(undefined1 *)((long)pvVar30 + (ulong)*(byte *)((long)pvVar27 + uVar54) * 2);
            uVar54 = uVar54 + 1;
          } while (uVar41 != uVar54);
          uVar54 = (ulong)uVar15;
          if (uVar15 != 0) {
            lVar51 = 0;
            do {
              memset((void *)((long)pvVar24 + lVar51),0,0x888);
              *(undefined8 *)((long)pvVar24 + lVar51 + 0x888) = 0x7ff0000000000000;
              lVar51 = lVar51 + 0x890;
            } while (uVar54 * 0x890 != lVar51);
          }
          uVar42 = 0;
          do {
            lVar51 = (ulong)*(byte *)((long)pvVar27 + uVar42) * 0x890;
            piVar1 = (int *)((long)pvVar24 +
                            (ulong)*(ushort *)((long)pvVar21 + uVar42 * 2) * 4 + lVar51);
            *piVar1 = *piVar1 + 1;
            plVar2 = (long *)((long)pvVar24 + lVar51 + 0x880);
            *plVar2 = *plVar2 + 1;
            uVar42 = uVar42 + 1;
          } while (uVar41 != uVar42);
          lVar35 = lVar35 + 1;
        } while (lVar35 != lVar53);
        BrotliFree(m,pvVar28);
        BrotliFree(m,pvVar29);
        BrotliFree(m,local_fa0);
        BrotliFree(m,pvVar30);
        BrotliFree(m,pvVar24);
        if (uVar25 == 0) {
          out_00 = (HistogramDistance *)BrotliAllocate(m,0x8070);
          puVar18 = (uint32_t *)BrotliAllocate(m,0x3c);
          local_fa8 = (void *)0xf;
          sVar40 = 0;
          pvVar24 = (void *)0x0;
          local_1008 = (uint32_t *)0x0;
          local_ff0 = (HistogramCommand *)0x0;
        }
        else {
          sVar40 = uVar25 * 4;
          local_1008 = (uint32_t *)BrotliAllocate(m,sVar40);
          pvVar24 = BrotliAllocate(m,sVar40);
          uVar54 = uVar25 * 0x10 + 0x3f0;
          local_fa8 = (void *)(uVar54 >> 6);
          if (uVar54 < 0x40) {
            puVar18 = (uint32_t *)0x0;
            out_00 = (HistogramDistance *)0x0;
          }
          else {
            out_00 = (HistogramDistance *)BrotliAllocate(m,(long)local_fa8 * 0x890);
            puVar18 = (uint32_t *)BrotliAllocate(m,(long)local_fa8 * 4);
          }
          uVar54 = 0x40;
          if (uVar25 < 0x40) {
            uVar54 = uVar25;
          }
          local_ff0 = (HistogramCommand *)BrotliAllocate(m,uVar54 * 0x890);
        }
        local_f78 = (HistogramPair *)BrotliAllocate(m,0xc018);
        lVar53 = 0;
        memset(sizes,0,0x100);
        memset(new_clusters,0,0x100);
        memset(symbols,0,0x100);
        memset(remap,0,0x100);
        memset(pvVar24,0,sVar40);
        uVar54 = 0;
        do {
          piVar1 = (int *)((long)pvVar24 + lVar53 * 4);
          *piVar1 = *piVar1 + 1;
          if ((uVar41 - 1 == uVar54) ||
             (*(char *)((long)pvVar27 + uVar54) != *(char *)((long)pvVar27 + uVar54 + 1))) {
            lVar53 = lVar53 + 1;
          }
          uVar54 = uVar54 + 1;
        } while (uVar41 != uVar54);
        if (uVar25 == 0) {
          uVar41 = 0;
        }
        else {
          local_f98 = 0;
          local_fa0 = (uint32_t *)0x0;
          local_fe0 = (void *)0x0;
          uVar41 = 0;
          local_ff8 = 0;
          uVar54 = uVar25;
          puVar32 = local_1008;
          pvVar28 = local_fa8;
          do {
            uVar42 = 0x40;
            if (uVar54 < 0x40) {
              uVar42 = uVar54;
            }
            lVar53 = uVar42 + (uVar42 == 0);
            lVar35 = 0;
            do {
              pHVar31 = (HistogramDistance *)((long)local_ff0 + lVar35 * 0x890);
              memset(pHVar31,0,0x888);
              ((HistogramDistance *)((long)local_ff0 + lVar35 * 0x890))->bit_cost_ = INFINITY;
              if (*(int *)((long)pvVar24 + ((long)local_fe0 + lVar35) * 4) != 0) {
                uVar42 = 0;
                do {
                  pHVar31->data_[*(ushort *)((long)pvVar21 + uVar42 * 2 + local_ff8 * 2)] =
                       pHVar31->data_[*(ushort *)((long)pvVar21 + uVar42 * 2 + local_ff8 * 2)] + 1;
                  uVar42 = uVar42 + 1;
                } while (uVar42 < *(uint *)((long)pvVar24 + ((long)local_fe0 + lVar35) * 4));
                pHVar31->total_count_ = uVar42;
                local_ff8 = local_ff8 + uVar42;
              }
              dVar56 = BrotliPopulationCostDistance(pHVar31);
              pHVar31->bit_cost_ = dVar56;
              new_clusters[lVar35] = (uint32_t)lVar35;
              symbols[lVar35] = (uint32_t)lVar35;
              sizes[lVar35] = 1;
              lVar35 = lVar35 + 1;
            } while (lVar35 != lVar53);
            sVar40 = uVar25 - (long)local_fe0;
            if (0x3f < sVar40) {
              sVar40 = 0x40;
            }
            sVar40 = BrotliHistogramCombineDistance
                               ((HistogramDistance *)local_ff0,sizes,symbols,new_clusters,local_f78,
                                sVar40,sVar40,0x40,0x800);
            uVar42 = local_f98 + sVar40;
            if (local_fa8 < uVar42) {
              pvVar29 = local_fa8;
              if (local_fa8 == (void *)0x0) {
                pvVar29 = (void *)uVar42;
              }
              do {
                uVar46 = (ulong)pvVar29;
                pvVar29 = (void *)(uVar46 * 2);
              } while (uVar46 < uVar42);
              pHVar31 = (HistogramDistance *)BrotliAllocate(m,uVar46 * 0x890);
              if (local_fa8 != (void *)0x0) {
                memcpy(pHVar31,out_00,(long)local_fa8 * 0x890);
              }
              BrotliFree(m,out_00);
              out_00 = pHVar31;
              local_fa8 = (void *)uVar46;
            }
            uVar42 = (long)local_fa0 + sVar40;
            if (pvVar28 < uVar42) {
              uVar46 = (ulong)pvVar28;
              if (pvVar28 == (void *)0x0) {
                uVar46 = uVar42;
              }
              do {
                uVar20 = uVar46;
                uVar46 = uVar20 * 2;
              } while (uVar20 < uVar42);
              __dest = (uint32_t *)BrotliAllocate(m,uVar20 * 4);
              if (pvVar28 != (void *)0x0) {
                memcpy(__dest,puVar18,(long)pvVar28 << 2);
              }
              BrotliFree(m,puVar18);
              pvVar28 = (void *)uVar20;
              puVar18 = __dest;
            }
            if (sVar40 != 0) {
              pHVar31 = out_00 + local_f98;
              sVar52 = 0;
              do {
                uVar50 = new_clusters[sVar52];
                memcpy(pHVar31,(HistogramDistance *)((long)local_ff0 + (ulong)uVar50 * 0x890),0x890)
                ;
                puVar18[(long)local_fa0 + sVar52] = sizes[uVar50];
                remap[new_clusters[sVar52]] = (uint32_t)sVar52;
                sVar52 = sVar52 + 1;
                pHVar31 = pHVar31 + 1;
              } while (sVar40 != sVar52);
              local_f98 = local_f98 + sVar52;
              local_fa0 = (uint32_t *)((long)local_fa0 + sVar52);
            }
            lVar35 = 0;
            do {
              puVar32[lVar35] = remap[symbols[lVar35]] + (int)uVar41;
              lVar35 = lVar35 + 1;
            } while (lVar53 != lVar35);
            uVar41 = uVar41 + sVar40;
            local_fe0 = (void *)((long)local_fe0 + 0x40);
            uVar54 = uVar54 - 0x40;
            puVar32 = puVar32 + 0x40;
          } while (local_fe0 < uVar25);
        }
        BrotliFree(m,local_ff0);
        uVar54 = (uVar41 >> 1) * uVar41;
        if (uVar41 << 6 < uVar54) {
          uVar54 = uVar41 << 6;
        }
        if (0x800 < uVar54) {
          BrotliFree(m,local_f78);
          local_f78 = (HistogramPair *)BrotliAllocate(m,uVar54 * 0x18 + 0x18);
        }
        if (uVar41 == 0) {
          puVar32 = (uint32_t *)0x0;
        }
        else {
          puVar32 = (uint32_t *)BrotliAllocate(m,uVar41 * 4);
          auVar64 = _DAT_0016bcd0;
          lVar53 = uVar41 - 1;
          auVar61._8_4_ = (int)lVar53;
          auVar61._0_8_ = lVar53;
          auVar61._12_4_ = (int)((ulong)lVar53 >> 0x20);
          uVar42 = 0;
          auVar61 = auVar61 ^ _DAT_0016bcd0;
          auVar71 = _DAT_0016bcc0;
          do {
            auVar95 = auVar71 ^ auVar64;
            if ((bool)(~(auVar95._4_4_ == auVar61._4_4_ && auVar61._0_4_ < auVar95._0_4_ ||
                        auVar61._4_4_ < auVar95._4_4_) & 1)) {
              puVar32[uVar42] = (uint32_t)uVar42;
            }
            if ((auVar95._12_4_ != auVar61._12_4_ || auVar95._8_4_ <= auVar61._8_4_) &&
                auVar95._12_4_ <= auVar61._12_4_) {
              puVar32[uVar42 + 1] = (uint32_t)uVar42 + 1;
            }
            uVar42 = uVar42 + 2;
            lVar53 = auVar71._8_8_;
            auVar71._0_8_ = auVar71._0_8_ + 2;
            auVar71._8_8_ = lVar53 + 2;
          } while ((uVar41 + 1 & 0xfffffffffffffffe) != uVar42);
        }
        sVar40 = BrotliHistogramCombineDistance
                           (out_00,puVar18,local_1008,puVar32,local_f78,uVar41,uVar25,0x100,uVar54);
        BrotliFree(m,local_f78);
        BrotliFree(m,puVar18);
        if (uVar41 == 0) {
          local_fe0 = (void *)0x0;
        }
        else {
          local_fe0 = BrotliAllocate(m,uVar41 << 2);
          memset(local_fe0,0xff,uVar41 << 2);
        }
        if (uVar25 != 0) {
          iVar120 = 0;
          uVar41 = 0;
          lVar53 = 0;
          do {
            memset(local_b40,0,0x888);
            local_2b8 = INFINITY;
            if (*(int *)((long)pvVar24 + uVar41 * 4) != 0) {
              uVar54 = 0;
              do {
                *(int *)(local_b40 + (ulong)*(ushort *)((long)pvVar21 + uVar54 * 2 + lVar53 * 2) * 4
                        ) = *(int *)(local_b40 +
                                    (ulong)*(ushort *)((long)pvVar21 + uVar54 * 2 + lVar53 * 2) * 4)
                            + 1;
                uVar54 = uVar54 + 1;
              } while (uVar54 < *(uint *)((long)pvVar24 + uVar41 * 4));
              lVar53 = lVar53 + uVar54;
              local_2c0 = uVar54;
            }
            lVar35 = 0;
            if (uVar41 != 0) {
              lVar35 = uVar41 - 1;
            }
            uVar50 = local_1008[lVar35];
            uVar54 = (ulong)uVar50;
            local_ff0 = (HistogramCommand *)
                        BrotliHistogramBitCostDistanceDistance
                                  ((HistogramDistance *)local_b40,out_00 + uVar54);
            if (sVar40 != 0) {
              sVar52 = 0;
              do {
                dVar56 = BrotliHistogramBitCostDistanceDistance
                                   ((HistogramDistance *)local_b40,out_00 + puVar32[sVar52]);
                if (dVar56 < (double)local_ff0) {
                  uVar54 = (ulong)puVar32[sVar52];
                  local_ff0 = (HistogramCommand *)dVar56;
                }
                uVar50 = (uint)uVar54;
                sVar52 = sVar52 + 1;
              } while (sVar40 != sVar52);
            }
            local_1008[uVar41] = uVar50;
            if (*(int *)((long)local_fe0 + uVar54 * 4) == -1) {
              *(int *)((long)local_fe0 + uVar54 * 4) = iVar120;
              iVar120 = iVar120 + 1;
            }
            uVar41 = uVar41 + 1;
          } while (uVar41 != uVar25);
        }
        BrotliFree(m,puVar32);
        BrotliFree(m,out_00);
        uVar41 = dist_split->types_alloc_size;
        if (uVar41 < uVar25) {
          if (uVar41 == 0) {
            uVar41 = uVar25;
          }
          do {
            uVar54 = uVar41;
            uVar41 = uVar54 * 2;
          } while (uVar54 < uVar25);
          puVar17 = (uint8_t *)BrotliAllocate(m,uVar54);
          if (dist_split->types_alloc_size != 0) {
            memcpy(puVar17,dist_split->types,dist_split->types_alloc_size);
          }
          BrotliFree(m,dist_split->types);
          dist_split->types = puVar17;
          dist_split->types_alloc_size = uVar54;
        }
        uVar41 = dist_split->lengths_alloc_size;
        if (uVar41 < uVar25) {
          if (uVar41 == 0) {
            uVar41 = uVar25;
          }
          do {
            uVar54 = uVar41;
            uVar41 = uVar54 * 2;
          } while (uVar54 < uVar25);
          puVar18 = (uint32_t *)BrotliAllocate(m,uVar54 * 4);
          if (dist_split->lengths_alloc_size != 0) {
            memcpy(puVar18,dist_split->lengths,dist_split->lengths_alloc_size << 2);
          }
          BrotliFree(m,dist_split->lengths);
          dist_split->lengths = puVar18;
          dist_split->lengths_alloc_size = uVar54;
LAB_0011fa54:
          uVar50 = 0;
          sVar40 = 0;
          uVar47 = 0;
          uVar41 = 0;
          do {
            uVar47 = uVar47 + *(int *)((long)pvVar24 + uVar41 * 4);
            if ((uVar25 - 1 == uVar41) || (local_1008[uVar41] != local_1008[uVar41 + 1])) {
              uVar44 = uVar50 & 0xff;
              uVar3 = *(uint *)((long)local_fe0 + (ulong)local_1008[uVar41] * 4);
              bVar45 = (byte)uVar3;
              dist_split->types[sVar40] = bVar45;
              bVar43 = (byte)uVar50;
              uVar50 = uVar3;
              if (bVar45 < bVar43) {
                uVar50 = uVar44;
              }
              dist_split->lengths[sVar40] = uVar47;
              sVar40 = sVar40 + 1;
              uVar47 = 0;
            }
            uVar41 = uVar41 + 1;
          } while (uVar25 != uVar41);
          sVar52 = (ulong)(uVar50 & 0xff) + 1;
        }
        else {
          if (uVar25 != 0) goto LAB_0011fa54;
          sVar52 = 1;
          sVar40 = 0;
        }
        dist_split->num_blocks = sVar40;
        dist_split->num_types = sVar52;
        BrotliFree(m,local_fe0);
        BrotliFree(m,pvVar24);
        BrotliFree(m,local_1008);
        BrotliFree(m,pvVar27);
        goto LAB_0011e7d7;
      }
    }
  }
  dist_split->num_types = 1;
LAB_0011e7d7:
  BrotliFree(m,pvVar21);
  return;
}

Assistant:

void BrotliSplitBlock(MemoryManager* m,
                      const Command* cmds,
                      const size_t num_commands,
                      const uint8_t* data,
                      const size_t pos,
                      const size_t mask,
                      const BrotliEncoderParams* params,
                      BlockSplit* literal_split,
                      BlockSplit* insert_and_copy_split,
                      BlockSplit* dist_split) {
  {
    size_t literals_count = CountLiterals(cmds, num_commands);
    uint8_t* literals = BROTLI_ALLOC(m, uint8_t, literals_count);
    if (BROTLI_IS_OOM(m)) return;
    /* Create a continuous array of literals. */
    CopyLiteralsToByteArray(cmds, num_commands, data, pos, mask, literals);
    /* Create the block split on the array of literals.
       Literal histograms have alphabet size 256. */
    SplitByteVectorLiteral(
        m, literals, literals_count,
        kSymbolsPerLiteralHistogram, kMaxLiteralHistograms,
        kLiteralStrideLength, kLiteralBlockSwitchCost, params,
        literal_split);
    if (BROTLI_IS_OOM(m)) return;
    BROTLI_FREE(m, literals);
  }

  {
    /* Compute prefix codes for commands. */
    uint16_t* insert_and_copy_codes = BROTLI_ALLOC(m, uint16_t, num_commands);
    size_t i;
    if (BROTLI_IS_OOM(m)) return;
    for (i = 0; i < num_commands; ++i) {
      insert_and_copy_codes[i] = cmds[i].cmd_prefix_;
    }
    /* Create the block split on the array of command prefixes. */
    SplitByteVectorCommand(
        m, insert_and_copy_codes, num_commands,
        kSymbolsPerCommandHistogram, kMaxCommandHistograms,
        kCommandStrideLength, kCommandBlockSwitchCost, params,
        insert_and_copy_split);
    if (BROTLI_IS_OOM(m)) return;
    /* TODO: reuse for distances? */
    BROTLI_FREE(m, insert_and_copy_codes);
  }

  {
    /* Create a continuous array of distance prefixes. */
    uint16_t* distance_prefixes = BROTLI_ALLOC(m, uint16_t, num_commands);
    size_t j = 0;
    size_t i;
    if (BROTLI_IS_OOM(m)) return;
    for (i = 0; i < num_commands; ++i) {
      const Command* cmd = &cmds[i];
      if (CommandCopyLen(cmd) && cmd->cmd_prefix_ >= 128) {
        distance_prefixes[j++] = cmd->dist_prefix_ & 0x3FF;
      }
    }
    /* Create the block split on the array of distance prefixes. */
    SplitByteVectorDistance(
        m, distance_prefixes, j,
        kSymbolsPerDistanceHistogram, kMaxCommandHistograms,
        kCommandStrideLength, kDistanceBlockSwitchCost, params,
        dist_split);
    if (BROTLI_IS_OOM(m)) return;
    BROTLI_FREE(m, distance_prefixes);
  }
}